

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx2::CurveNvIntersectorK<8,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  float *pfVar4;
  uint uVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  code *pcVar15;
  RTCFilterFunctionN p_Var16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  ulong uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined8 uVar92;
  undefined1 auVar93 [32];
  undefined1 auVar94 [28];
  undefined1 auVar95 [28];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  int iVar98;
  undefined4 uVar99;
  ulong uVar100;
  Geometry *pGVar101;
  RTCIntersectArguments *pRVar102;
  ulong uVar103;
  uint uVar104;
  ulong uVar105;
  ulong uVar106;
  Geometry *pGVar107;
  long lVar108;
  long lVar109;
  undefined4 uVar110;
  undefined8 uVar111;
  float fVar126;
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar125;
  float fVar127;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar113 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar131;
  undefined1 auVar133 [16];
  undefined8 uVar132;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar143;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar144;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar145;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  float fVar159;
  float fVar163;
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined8 uVar171;
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [16];
  undefined1 auVar186 [32];
  undefined1 auVar185 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar197 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar200 [64];
  undefined1 auVar202 [16];
  undefined4 uVar201;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  float fVar206;
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  RTCFilterFunctionNArguments args;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  long local_650;
  ulong local_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  int local_360;
  int local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar14 = prim[1];
  uVar100 = (ulong)(byte)PVar14;
  auVar167 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar167 = vinsertps_avx(auVar167,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar145 = *(float *)(prim + uVar100 * 0x19 + 0x12);
  auVar167 = vsubps_avx(auVar167,*(undefined1 (*) [16])(prim + uVar100 * 0x19 + 6));
  auVar112._0_4_ = fVar145 * auVar167._0_4_;
  auVar112._4_4_ = fVar145 * auVar167._4_4_;
  auVar112._8_4_ = fVar145 * auVar167._8_4_;
  auVar112._12_4_ = fVar145 * auVar167._12_4_;
  auVar172._0_4_ = fVar145 * auVar17._0_4_;
  auVar172._4_4_ = fVar145 * auVar17._4_4_;
  auVar172._8_4_ = fVar145 * auVar17._8_4_;
  auVar172._12_4_ = fVar145 * auVar17._12_4_;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + uVar100 * 4 + 6);
  auVar115 = vpmovsxbd_avx2(auVar167);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar100 * 5 + 6);
  auVar196 = vpmovsxbd_avx2(auVar17);
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar100 * 6 + 6);
  auVar121 = vpmovsxbd_avx2(auVar8);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar100 * 0xb + 6);
  auVar140 = vpmovsxbd_avx2(auVar9);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *(ulong *)(prim + uVar100 * 0xc + 6);
  auVar124 = vpmovsxbd_avx2(auVar164);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar100 * 0xd + 6);
  auVar19 = vpmovsxbd_avx2(auVar10);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar100 * 0x12 + 6);
  auVar190 = vpmovsxbd_avx2(auVar11);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar100 * 0x13 + 6);
  auVar199 = vpmovsxbd_avx2(auVar12);
  auVar199 = vcvtdq2ps_avx(auVar199);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar100 * 0x14 + 6);
  auVar123 = vpmovsxbd_avx2(auVar13);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar211._4_4_ = auVar172._0_4_;
  auVar211._0_4_ = auVar172._0_4_;
  auVar211._8_4_ = auVar172._0_4_;
  auVar211._12_4_ = auVar172._0_4_;
  auVar211._16_4_ = auVar172._0_4_;
  auVar211._20_4_ = auVar172._0_4_;
  auVar211._24_4_ = auVar172._0_4_;
  auVar211._28_4_ = auVar172._0_4_;
  auVar167 = vmovshdup_avx(auVar172);
  uVar171 = auVar167._0_8_;
  auVar217._8_8_ = uVar171;
  auVar217._0_8_ = uVar171;
  auVar217._16_8_ = uVar171;
  auVar217._24_8_ = uVar171;
  auVar167 = vshufps_avx(auVar172,auVar172,0xaa);
  fVar145 = auVar167._0_4_;
  auVar205._0_4_ = fVar145 * auVar121._0_4_;
  fVar144 = auVar167._4_4_;
  auVar205._4_4_ = fVar144 * auVar121._4_4_;
  auVar205._8_4_ = fVar145 * auVar121._8_4_;
  auVar205._12_4_ = fVar144 * auVar121._12_4_;
  auVar205._16_4_ = fVar145 * auVar121._16_4_;
  auVar205._20_4_ = fVar144 * auVar121._20_4_;
  auVar205._28_36_ = in_ZMM10._28_36_;
  auVar205._24_4_ = fVar145 * auVar121._24_4_;
  auVar200._0_4_ = auVar19._0_4_ * fVar145;
  auVar200._4_4_ = auVar19._4_4_ * fVar144;
  auVar200._8_4_ = auVar19._8_4_ * fVar145;
  auVar200._12_4_ = auVar19._12_4_ * fVar144;
  auVar200._16_4_ = auVar19._16_4_ * fVar145;
  auVar200._20_4_ = auVar19._20_4_ * fVar144;
  auVar200._28_36_ = in_ZMM9._28_36_;
  auVar200._24_4_ = auVar19._24_4_ * fVar145;
  auVar186._0_4_ = auVar123._0_4_ * fVar145;
  auVar186._4_4_ = auVar123._4_4_ * fVar144;
  auVar186._8_4_ = auVar123._8_4_ * fVar145;
  auVar186._12_4_ = auVar123._12_4_ * fVar144;
  auVar186._16_4_ = auVar123._16_4_ * fVar145;
  auVar186._20_4_ = auVar123._20_4_ * fVar144;
  auVar186._24_4_ = auVar123._24_4_ * fVar145;
  auVar186._28_4_ = 0;
  auVar167 = vfmadd231ps_fma(auVar205._0_32_,auVar217,auVar196);
  auVar17 = vfmadd231ps_fma(auVar200._0_32_,auVar217,auVar124);
  auVar8 = vfmadd231ps_fma(auVar186,auVar199,auVar217);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar211,auVar115);
  auVar200 = ZEXT1664(auVar9);
  auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar211,auVar140);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar190,auVar211);
  auVar212._4_4_ = auVar112._0_4_;
  auVar212._0_4_ = auVar112._0_4_;
  auVar212._8_4_ = auVar112._0_4_;
  auVar212._12_4_ = auVar112._0_4_;
  auVar212._16_4_ = auVar112._0_4_;
  auVar212._20_4_ = auVar112._0_4_;
  auVar212._24_4_ = auVar112._0_4_;
  auVar212._28_4_ = auVar112._0_4_;
  auVar167 = vmovshdup_avx(auVar112);
  uVar171 = auVar167._0_8_;
  auVar218._8_8_ = uVar171;
  auVar218._0_8_ = uVar171;
  auVar218._16_8_ = uVar171;
  auVar218._24_8_ = uVar171;
  auVar167 = vshufps_avx(auVar112,auVar112,0xaa);
  fVar145 = auVar167._0_4_;
  auVar173._0_4_ = fVar145 * auVar121._0_4_;
  fVar144 = auVar167._4_4_;
  auVar173._4_4_ = fVar144 * auVar121._4_4_;
  auVar173._8_4_ = fVar145 * auVar121._8_4_;
  auVar173._12_4_ = fVar144 * auVar121._12_4_;
  auVar173._16_4_ = fVar145 * auVar121._16_4_;
  auVar173._20_4_ = fVar144 * auVar121._20_4_;
  auVar173._24_4_ = fVar145 * auVar121._24_4_;
  auVar173._28_4_ = 0;
  auVar18._4_4_ = auVar19._4_4_ * fVar144;
  auVar18._0_4_ = auVar19._0_4_ * fVar145;
  auVar18._8_4_ = auVar19._8_4_ * fVar145;
  auVar18._12_4_ = auVar19._12_4_ * fVar144;
  auVar18._16_4_ = auVar19._16_4_ * fVar145;
  auVar18._20_4_ = auVar19._20_4_ * fVar144;
  auVar18._24_4_ = auVar19._24_4_ * fVar145;
  auVar18._28_4_ = auVar121._28_4_;
  auVar121._4_4_ = auVar123._4_4_ * fVar144;
  auVar121._0_4_ = auVar123._0_4_ * fVar145;
  auVar121._8_4_ = auVar123._8_4_ * fVar145;
  auVar121._12_4_ = auVar123._12_4_ * fVar144;
  auVar121._16_4_ = auVar123._16_4_ * fVar145;
  auVar121._20_4_ = auVar123._20_4_ * fVar144;
  auVar121._24_4_ = auVar123._24_4_ * fVar145;
  auVar121._28_4_ = fVar144;
  auVar167 = vfmadd231ps_fma(auVar173,auVar218,auVar196);
  auVar164 = vfmadd231ps_fma(auVar18,auVar218,auVar124);
  auVar10 = vfmadd231ps_fma(auVar121,auVar218,auVar199);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar212,auVar115);
  local_420._8_4_ = 0x7fffffff;
  local_420._0_8_ = 0x7fffffff7fffffff;
  local_420._12_4_ = 0x7fffffff;
  local_420._16_4_ = 0x7fffffff;
  local_420._20_4_ = 0x7fffffff;
  local_420._24_4_ = 0x7fffffff;
  local_420._28_4_ = 0x7fffffff;
  auVar205 = ZEXT3264(local_420);
  auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar212,auVar140);
  auVar115 = vandps_avx(ZEXT1632(auVar9),local_420);
  auVar180._8_4_ = 0x219392ef;
  auVar180._0_8_ = 0x219392ef219392ef;
  auVar180._12_4_ = 0x219392ef;
  auVar180._16_4_ = 0x219392ef;
  auVar180._20_4_ = 0x219392ef;
  auVar180._24_4_ = 0x219392ef;
  auVar180._28_4_ = 0x219392ef;
  auVar115 = vcmpps_avx(auVar115,auVar180,1);
  auVar196 = vblendvps_avx(ZEXT1632(auVar9),auVar180,auVar115);
  auVar115 = vandps_avx(ZEXT1632(auVar17),local_420);
  auVar115 = vcmpps_avx(auVar115,auVar180,1);
  auVar121 = vblendvps_avx(ZEXT1632(auVar17),auVar180,auVar115);
  auVar115 = vandps_avx(local_420,ZEXT1632(auVar8));
  auVar115 = vcmpps_avx(auVar115,auVar180,1);
  auVar140 = vrcpps_avx(auVar196);
  auVar115 = vblendvps_avx(ZEXT1632(auVar8),auVar180,auVar115);
  auVar187._8_4_ = 0x3f800000;
  auVar187._0_8_ = 0x3f8000003f800000;
  auVar187._12_4_ = 0x3f800000;
  auVar187._16_4_ = 0x3f800000;
  auVar187._20_4_ = 0x3f800000;
  auVar187._24_4_ = 0x3f800000;
  auVar187._28_4_ = 0x3f800000;
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar212,auVar190);
  auVar124 = vrcpps_avx(auVar121);
  auVar167 = vfnmadd213ps_fma(auVar196,auVar140,auVar187);
  auVar167 = vfmadd132ps_fma(ZEXT1632(auVar167),auVar140,auVar140);
  auVar17 = vfnmadd213ps_fma(auVar121,auVar124,auVar187);
  auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar124,auVar124);
  auVar196 = vrcpps_avx(auVar115);
  auVar8 = vfnmadd213ps_fma(auVar115,auVar196,auVar187);
  auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar196,auVar196);
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 7 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar11));
  auVar140._4_4_ = auVar167._4_4_ * auVar115._4_4_;
  auVar140._0_4_ = auVar167._0_4_ * auVar115._0_4_;
  auVar140._8_4_ = auVar167._8_4_ * auVar115._8_4_;
  auVar140._12_4_ = auVar167._12_4_ * auVar115._12_4_;
  auVar140._16_4_ = auVar115._16_4_ * 0.0;
  auVar140._20_4_ = auVar115._20_4_ * 0.0;
  auVar140._24_4_ = auVar115._24_4_ * 0.0;
  auVar140._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 9 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar11));
  auVar124._4_4_ = auVar167._4_4_ * auVar115._4_4_;
  auVar124._0_4_ = auVar167._0_4_ * auVar115._0_4_;
  auVar124._8_4_ = auVar167._8_4_ * auVar115._8_4_;
  auVar124._12_4_ = auVar167._12_4_ * auVar115._12_4_;
  auVar124._16_4_ = auVar115._16_4_ * 0.0;
  auVar124._20_4_ = auVar115._20_4_ * 0.0;
  auVar124._24_4_ = auVar115._24_4_ * 0.0;
  auVar124._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0xe + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar164));
  auVar19._4_4_ = auVar17._4_4_ * auVar115._4_4_;
  auVar19._0_4_ = auVar17._0_4_ * auVar115._0_4_;
  auVar19._8_4_ = auVar17._8_4_ * auVar115._8_4_;
  auVar19._12_4_ = auVar17._12_4_ * auVar115._12_4_;
  auVar19._16_4_ = auVar115._16_4_ * 0.0;
  auVar19._20_4_ = auVar115._20_4_ * 0.0;
  auVar19._24_4_ = auVar115._24_4_ * 0.0;
  auVar19._28_4_ = auVar115._28_4_;
  auVar134._1_3_ = 0;
  auVar134[0] = PVar14;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar14 * 0x10 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar164));
  auVar190._4_4_ = auVar17._4_4_ * auVar115._4_4_;
  auVar190._0_4_ = auVar17._0_4_ * auVar115._0_4_;
  auVar190._8_4_ = auVar17._8_4_ * auVar115._8_4_;
  auVar190._12_4_ = auVar17._12_4_ * auVar115._12_4_;
  auVar190._16_4_ = auVar115._16_4_ * 0.0;
  auVar190._20_4_ = auVar115._20_4_ * 0.0;
  auVar190._24_4_ = auVar115._24_4_ * 0.0;
  auVar190._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x15 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar9));
  auVar199._4_4_ = auVar115._4_4_ * auVar8._4_4_;
  auVar199._0_4_ = auVar115._0_4_ * auVar8._0_4_;
  auVar199._8_4_ = auVar115._8_4_ * auVar8._8_4_;
  auVar199._12_4_ = auVar115._12_4_ * auVar8._12_4_;
  auVar199._16_4_ = auVar115._16_4_ * 0.0;
  auVar199._20_4_ = auVar115._20_4_ * 0.0;
  auVar199._24_4_ = auVar115._24_4_ * 0.0;
  auVar199._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x17 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar9));
  auVar123._4_4_ = auVar8._4_4_ * auVar115._4_4_;
  auVar123._0_4_ = auVar8._0_4_ * auVar115._0_4_;
  auVar123._8_4_ = auVar8._8_4_ * auVar115._8_4_;
  auVar123._12_4_ = auVar8._12_4_ * auVar115._12_4_;
  auVar123._16_4_ = auVar115._16_4_ * 0.0;
  auVar123._20_4_ = auVar115._20_4_ * 0.0;
  auVar123._24_4_ = auVar115._24_4_ * 0.0;
  auVar123._28_4_ = auVar115._28_4_;
  auVar115 = vpminsd_avx2(auVar140,auVar124);
  auVar196 = vpminsd_avx2(auVar19,auVar190);
  auVar115 = vmaxps_avx(auVar115,auVar196);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar189._4_4_ = uVar110;
  auVar189._0_4_ = uVar110;
  auVar189._8_4_ = uVar110;
  auVar189._12_4_ = uVar110;
  auVar189._16_4_ = uVar110;
  auVar189._20_4_ = uVar110;
  auVar189._24_4_ = uVar110;
  auVar189._28_4_ = uVar110;
  auVar196 = vpminsd_avx2(auVar199,auVar123);
  auVar196 = vmaxps_avx(auVar196,auVar189);
  auVar115 = vmaxps_avx(auVar115,auVar196);
  local_80._4_4_ = auVar115._4_4_ * 0.99999964;
  local_80._0_4_ = auVar115._0_4_ * 0.99999964;
  local_80._8_4_ = auVar115._8_4_ * 0.99999964;
  local_80._12_4_ = auVar115._12_4_ * 0.99999964;
  local_80._16_4_ = auVar115._16_4_ * 0.99999964;
  local_80._20_4_ = auVar115._20_4_ * 0.99999964;
  local_80._24_4_ = auVar115._24_4_ * 0.99999964;
  local_80._28_4_ = auVar196._28_4_;
  auVar115 = vpmaxsd_avx2(auVar140,auVar124);
  auVar196 = vpmaxsd_avx2(auVar19,auVar190);
  auVar115 = vminps_avx(auVar115,auVar196);
  auVar196 = vpmaxsd_avx2(auVar199,auVar123);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar151._4_4_ = uVar110;
  auVar151._0_4_ = uVar110;
  auVar151._8_4_ = uVar110;
  auVar151._12_4_ = uVar110;
  auVar151._16_4_ = uVar110;
  auVar151._20_4_ = uVar110;
  auVar151._24_4_ = uVar110;
  auVar151._28_4_ = uVar110;
  auVar196 = vminps_avx(auVar196,auVar151);
  auVar115 = vminps_avx(auVar115,auVar196);
  auVar135._4_4_ = auVar115._4_4_ * 1.0000004;
  auVar135._0_4_ = auVar115._0_4_ * 1.0000004;
  auVar135._8_4_ = auVar115._8_4_ * 1.0000004;
  auVar135._12_4_ = auVar115._12_4_ * 1.0000004;
  auVar135._16_4_ = auVar115._16_4_ * 1.0000004;
  auVar135._20_4_ = auVar115._20_4_ * 1.0000004;
  auVar135._24_4_ = auVar115._24_4_ * 1.0000004;
  auVar135._28_4_ = auVar115._28_4_;
  auVar134[4] = PVar14;
  auVar134._5_3_ = 0;
  auVar134[8] = PVar14;
  auVar134._9_3_ = 0;
  auVar134[0xc] = PVar14;
  auVar134._13_3_ = 0;
  auVar134[0x10] = PVar14;
  auVar134._17_3_ = 0;
  auVar134[0x14] = PVar14;
  auVar134._21_3_ = 0;
  auVar134[0x18] = PVar14;
  auVar134._25_3_ = 0;
  auVar134[0x1c] = PVar14;
  auVar134._29_3_ = 0;
  auVar196 = vpcmpgtd_avx2(auVar134,_DAT_01fb4ba0);
  auVar115 = vcmpps_avx(local_80,auVar135,2);
  auVar115 = vandps_avx(auVar115,auVar196);
  uVar104 = vmovmskps_avx(auVar115);
  local_640 = mm_lookupmask_ps._16_8_;
  uStack_638 = mm_lookupmask_ps._24_8_;
  uStack_630 = mm_lookupmask_ps._16_8_;
  uStack_628 = mm_lookupmask_ps._24_8_;
  iVar98 = 1 << ((uint)k & 0x1f);
  auVar115._4_4_ = iVar98;
  auVar115._0_4_ = iVar98;
  auVar115._8_4_ = iVar98;
  auVar115._12_4_ = iVar98;
  auVar115._16_4_ = iVar98;
  auVar115._20_4_ = iVar98;
  auVar115._24_4_ = iVar98;
  auVar115._28_4_ = iVar98;
  auVar196 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar115 = vpand_avx2(auVar115,auVar196);
  local_440 = vpcmpeqd_avx2(auVar115,auVar196);
  for (; auVar115 = local_600, local_648 = (ulong)uVar104, local_648 != 0;
      uVar104 = (uint)uVar106 & uVar104) {
    local_6c0 = auVar200._0_32_;
    lVar109 = 0;
    for (uVar103 = local_648; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
      lVar109 = lVar109 + 1;
    }
    uVar106 = local_648 - 1 & local_648;
    local_5c0._4_4_ = *(undefined4 *)(prim + lVar109 * 4 + 6);
    uVar103 = (ulong)(uint)((int)lVar109 << 6);
    uVar104 = *(uint *)(prim + 2);
    pGVar107 = (context->scene->geometries).items[uVar104].ptr;
    pPVar1 = prim + uVar103 + uVar100 * 0x19 + 0x16;
    uVar171 = *(undefined8 *)pPVar1;
    uVar92 = *(undefined8 *)(pPVar1 + 8);
    auVar17 = *(undefined1 (*) [16])pPVar1;
    auVar167 = *(undefined1 (*) [16])pPVar1;
    if (uVar106 != 0) {
      uVar105 = uVar106 - 1 & uVar106;
      for (uVar20 = uVar106; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
      }
      if (uVar105 != 0) {
        for (; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar8 = *(undefined1 (*) [16])(prim + uVar103 + uVar100 * 0x19 + 0x26);
    auVar9 = *(undefined1 (*) [16])(prim + uVar103 + uVar100 * 0x19 + 0x36);
    _local_660 = *(undefined1 (*) [16])(prim + uVar103 + uVar100 * 0x19 + 0x46);
    auVar164 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    auVar12 = vinsertps_avx(auVar164,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    iVar98 = (int)pGVar107[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar10 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar12);
    uVar110 = auVar10._0_4_;
    auVar160._4_4_ = uVar110;
    auVar160._0_4_ = uVar110;
    auVar160._8_4_ = uVar110;
    auVar160._12_4_ = uVar110;
    auVar164 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    aVar6 = pre->ray_space[k].vx.field_0;
    aVar7 = pre->ray_space[k].vy.field_0;
    fVar145 = pre->ray_space[k].vz.field_0.m128[0];
    fVar144 = pre->ray_space[k].vz.field_0.m128[1];
    fVar125 = pre->ray_space[k].vz.field_0.m128[2];
    fVar126 = pre->ray_space[k].vz.field_0.m128[3];
    auVar177._0_4_ = fVar145 * auVar10._0_4_;
    auVar177._4_4_ = fVar144 * auVar10._4_4_;
    auVar177._8_4_ = fVar125 * auVar10._8_4_;
    auVar177._12_4_ = fVar126 * auVar10._12_4_;
    auVar164 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar7,auVar164);
    auVar112 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar6,auVar160);
    auVar164 = vblendps_avx(auVar112,*(undefined1 (*) [16])pPVar1,8);
    auVar11 = vsubps_avx(auVar8,auVar12);
    uVar110 = auVar11._0_4_;
    auVar178._4_4_ = uVar110;
    auVar178._0_4_ = uVar110;
    auVar178._8_4_ = uVar110;
    auVar178._12_4_ = uVar110;
    auVar10 = vshufps_avx(auVar11,auVar11,0x55);
    auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
    auVar193._0_4_ = fVar145 * auVar11._0_4_;
    auVar193._4_4_ = fVar144 * auVar11._4_4_;
    auVar193._8_4_ = fVar125 * auVar11._8_4_;
    auVar193._12_4_ = fVar126 * auVar11._12_4_;
    auVar10 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar7,auVar10);
    auVar172 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar6,auVar178);
    auVar10 = vblendps_avx(auVar172,auVar8,8);
    auVar13 = vsubps_avx(auVar9,auVar12);
    uVar110 = auVar13._0_4_;
    auVar184._4_4_ = uVar110;
    auVar184._0_4_ = uVar110;
    auVar184._8_4_ = uVar110;
    auVar184._12_4_ = uVar110;
    auVar11 = vshufps_avx(auVar13,auVar13,0x55);
    auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
    auVar202._0_4_ = fVar145 * auVar13._0_4_;
    auVar202._4_4_ = fVar144 * auVar13._4_4_;
    auVar202._8_4_ = fVar125 * auVar13._8_4_;
    auVar202._12_4_ = fVar126 * auVar13._12_4_;
    auVar11 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar7,auVar11);
    auVar160 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar6,auVar184);
    auVar11 = vblendps_avx(auVar160,auVar9,8);
    auVar13 = vsubps_avx(_local_660,auVar12);
    uVar110 = auVar13._0_4_;
    auVar185._4_4_ = uVar110;
    auVar185._0_4_ = uVar110;
    auVar185._8_4_ = uVar110;
    auVar185._12_4_ = uVar110;
    auVar12 = vshufps_avx(auVar13,auVar13,0x55);
    auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
    auVar207._0_4_ = fVar145 * auVar13._0_4_;
    auVar207._4_4_ = fVar144 * auVar13._4_4_;
    auVar207._8_4_ = fVar125 * auVar13._8_4_;
    auVar207._12_4_ = fVar126 * auVar13._12_4_;
    auVar12 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar7,auVar12);
    auVar177 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar6,auVar185);
    auVar12 = vblendps_avx(auVar177,_local_660,8);
    auVar133._8_4_ = 0x7fffffff;
    auVar133._0_8_ = 0x7fffffff7fffffff;
    auVar133._12_4_ = 0x7fffffff;
    auVar164 = vandps_avx(auVar164,auVar133);
    auVar10 = vandps_avx(auVar10,auVar133);
    auVar13 = vmaxps_avx(auVar164,auVar10);
    auVar164 = vandps_avx(auVar11,auVar133);
    auVar10 = vandps_avx(auVar12,auVar133);
    auVar164 = vmaxps_avx(auVar164,auVar10);
    auVar164 = vmaxps_avx(auVar13,auVar164);
    auVar10 = vmovshdup_avx(auVar164);
    auVar10 = vmaxss_avx(auVar10,auVar164);
    auVar164 = vshufpd_avx(auVar164,auVar164,1);
    auVar164 = vmaxss_avx(auVar164,auVar10);
    local_650 = (long)iVar98;
    lVar109 = local_650 * 0x44;
    auVar10 = vmovshdup_avx(auVar112);
    uVar111 = auVar10._0_8_;
    local_5a0._8_8_ = uVar111;
    local_5a0._0_8_ = uVar111;
    local_5a0._16_8_ = uVar111;
    local_5a0._24_8_ = uVar111;
    auVar10 = vmovshdup_avx(auVar172);
    uVar111 = auVar10._0_8_;
    local_460._8_8_ = uVar111;
    local_460._0_8_ = uVar111;
    local_460._16_8_ = uVar111;
    local_460._24_8_ = uVar111;
    auVar196 = *(undefined1 (*) [32])(bspline_basis0 + lVar109 + 0x908);
    uVar201 = auVar160._0_4_;
    auVar152._4_4_ = uVar201;
    auVar152._0_4_ = uVar201;
    auVar152._8_4_ = uVar201;
    auVar152._12_4_ = uVar201;
    auVar152._16_4_ = uVar201;
    auVar152._20_4_ = uVar201;
    auVar152._24_4_ = uVar201;
    auVar152._28_4_ = uVar201;
    auVar10 = vmovshdup_avx(auVar160);
    uVar111 = auVar10._0_8_;
    auVar203._8_8_ = uVar111;
    auVar203._0_8_ = uVar111;
    auVar203._16_8_ = uVar111;
    auVar203._24_8_ = uVar111;
    fVar145 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar109 + 0xd8c);
    auVar94 = *(undefined1 (*) [28])(bspline_basis0 + lVar109 + 0xd8c);
    fVar206 = auVar177._0_4_;
    auVar10 = vmovshdup_avx(auVar177);
    uVar111 = auVar10._0_8_;
    auVar21._4_4_ = fVar206 * *(float *)(bspline_basis0 + lVar109 + 0xd90);
    auVar21._0_4_ = fVar206 * fVar145;
    auVar21._8_4_ = fVar206 * *(float *)(bspline_basis0 + lVar109 + 0xd94);
    auVar21._12_4_ = fVar206 * *(float *)(bspline_basis0 + lVar109 + 0xd98);
    auVar21._16_4_ = fVar206 * *(float *)(bspline_basis0 + lVar109 + 0xd9c);
    auVar21._20_4_ = fVar206 * *(float *)(bspline_basis0 + lVar109 + 0xda0);
    auVar21._24_4_ = fVar206 * *(float *)(bspline_basis0 + lVar109 + 0xda4);
    auVar21._28_4_ = *(undefined4 *)(bspline_basis0 + lVar109 + 0xda8);
    auVar11 = vfmadd231ps_fma(auVar21,auVar196,auVar152);
    fVar159 = auVar10._0_4_;
    auVar213._0_4_ = fVar159 * fVar145;
    fVar163 = auVar10._4_4_;
    auVar213._4_4_ = fVar163 * *(float *)(bspline_basis0 + lVar109 + 0xd90);
    auVar213._8_4_ = fVar159 * *(float *)(bspline_basis0 + lVar109 + 0xd94);
    auVar213._12_4_ = fVar163 * *(float *)(bspline_basis0 + lVar109 + 0xd98);
    auVar213._16_4_ = fVar159 * *(float *)(bspline_basis0 + lVar109 + 0xd9c);
    auVar213._20_4_ = fVar163 * *(float *)(bspline_basis0 + lVar109 + 0xda0);
    auVar213._24_4_ = fVar159 * *(float *)(bspline_basis0 + lVar109 + 0xda4);
    auVar213._28_4_ = 0;
    auVar10 = vfmadd231ps_fma(auVar213,auVar196,auVar203);
    auVar121 = *(undefined1 (*) [32])(bspline_basis0 + lVar109 + 0x484);
    uVar110 = auVar172._0_4_;
    auVar198._4_4_ = uVar110;
    auVar198._0_4_ = uVar110;
    auVar198._8_4_ = uVar110;
    auVar198._12_4_ = uVar110;
    auVar198._16_4_ = uVar110;
    auVar198._20_4_ = uVar110;
    auVar198._24_4_ = uVar110;
    auVar198._28_4_ = uVar110;
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar121,auVar198);
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar121,local_460);
    auVar140 = *(undefined1 (*) [32])(bspline_basis0 + lVar109);
    local_6a0._0_4_ = auVar112._0_4_;
    auVar215._4_4_ = local_6a0._0_4_;
    auVar215._0_4_ = local_6a0._0_4_;
    auVar215._8_4_ = local_6a0._0_4_;
    auVar215._12_4_ = local_6a0._0_4_;
    auVar215._16_4_ = local_6a0._0_4_;
    auVar215._20_4_ = local_6a0._0_4_;
    auVar215._24_4_ = local_6a0._0_4_;
    auVar215._28_4_ = local_6a0._0_4_;
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar140,auVar215);
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar140,local_5a0);
    auVar124 = *(undefined1 (*) [32])(bspline_basis1 + lVar109 + 0x908);
    fVar130 = *(float *)(bspline_basis1 + lVar109 + 0xd8c);
    fVar81 = *(float *)(bspline_basis1 + lVar109 + 0xd90);
    fVar82 = *(float *)(bspline_basis1 + lVar109 + 0xd94);
    fVar83 = *(float *)(bspline_basis1 + lVar109 + 0xd98);
    fVar84 = *(float *)(bspline_basis1 + lVar109 + 0xd9c);
    fVar85 = *(float *)(bspline_basis1 + lVar109 + 0xda0);
    fVar86 = *(float *)(bspline_basis1 + lVar109 + 0xda4);
    auVar22._4_4_ = fVar81 * fVar206;
    auVar22._0_4_ = fVar130 * fVar206;
    auVar22._8_4_ = fVar82 * fVar206;
    auVar22._12_4_ = fVar83 * fVar206;
    auVar22._16_4_ = fVar84 * fVar206;
    auVar22._20_4_ = fVar85 * fVar206;
    auVar22._24_4_ = fVar86 * fVar206;
    auVar22._28_4_ = *(undefined4 *)(bspline_basis0 + lVar109 + 0xda8);
    auVar12 = vfmadd231ps_fma(auVar22,auVar124,auVar152);
    auVar23._4_4_ = fVar81 * fVar163;
    auVar23._0_4_ = fVar130 * fVar159;
    auVar23._8_4_ = fVar82 * fVar159;
    auVar23._12_4_ = fVar83 * fVar163;
    auVar23._16_4_ = fVar84 * fVar159;
    auVar23._20_4_ = fVar85 * fVar163;
    auVar23._24_4_ = fVar86 * fVar159;
    auVar23._28_4_ = uVar201;
    auVar13 = vfmadd231ps_fma(auVar23,auVar124,auVar203);
    auVar19 = *(undefined1 (*) [32])(bspline_basis1 + lVar109 + 0x484);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar19,auVar198);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar19,local_460);
    auVar190 = *(undefined1 (*) [32])(bspline_basis1 + lVar109);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar190,auVar215);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar190,local_5a0);
    _local_480 = ZEXT1632(auVar12);
    auVar135 = ZEXT1632(auVar11);
    auVar123 = vsubps_avx(_local_480,auVar135);
    _local_4a0 = ZEXT1632(auVar13);
    local_4c0 = ZEXT1632(auVar10);
    local_4e0 = vsubps_avx(_local_4a0,local_4c0);
    auVar116._0_4_ = auVar10._0_4_ * auVar123._0_4_;
    auVar116._4_4_ = auVar10._4_4_ * auVar123._4_4_;
    auVar116._8_4_ = auVar10._8_4_ * auVar123._8_4_;
    auVar116._12_4_ = auVar10._12_4_ * auVar123._12_4_;
    auVar116._16_4_ = auVar123._16_4_ * 0.0;
    auVar116._20_4_ = auVar123._20_4_ * 0.0;
    auVar116._24_4_ = auVar123._24_4_ * 0.0;
    auVar116._28_4_ = 0;
    fVar145 = local_4e0._0_4_;
    auVar136._0_4_ = auVar11._0_4_ * fVar145;
    fVar144 = local_4e0._4_4_;
    auVar136._4_4_ = auVar11._4_4_ * fVar144;
    fVar125 = local_4e0._8_4_;
    auVar136._8_4_ = auVar11._8_4_ * fVar125;
    fVar126 = local_4e0._12_4_;
    auVar136._12_4_ = auVar11._12_4_ * fVar126;
    fVar127 = local_4e0._16_4_;
    auVar136._16_4_ = fVar127 * 0.0;
    fVar128 = local_4e0._20_4_;
    auVar136._20_4_ = fVar128 * 0.0;
    fVar129 = local_4e0._24_4_;
    auVar136._24_4_ = fVar129 * 0.0;
    auVar136._28_4_ = 0;
    auVar18 = vsubps_avx(auVar116,auVar136);
    auVar10 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
    uVar132 = auVar10._0_8_;
    local_a0._8_8_ = uVar132;
    local_a0._0_8_ = uVar132;
    local_a0._16_8_ = uVar132;
    local_a0._24_8_ = uVar132;
    auVar11 = vpermilps_avx(auVar8,0xff);
    uVar132 = auVar11._0_8_;
    local_c0._8_8_ = uVar132;
    local_c0._0_8_ = uVar132;
    local_c0._16_8_ = uVar132;
    local_c0._24_8_ = uVar132;
    auVar11 = vpermilps_avx(auVar9,0xff);
    uVar132 = auVar11._0_8_;
    local_e0._8_8_ = uVar132;
    local_e0._0_8_ = uVar132;
    local_e0._16_8_ = uVar132;
    local_e0._24_8_ = uVar132;
    auVar11 = vpermilps_avx(_local_660,0xff);
    local_100 = auVar11._0_8_;
    local_900 = auVar94._0_4_;
    fStack_8fc = auVar94._4_4_;
    fStack_8f8 = auVar94._8_4_;
    fStack_8f4 = auVar94._12_4_;
    fStack_8f0 = auVar94._16_4_;
    fStack_8ec = auVar94._20_4_;
    fStack_8e8 = auVar94._24_4_;
    fVar131 = auVar11._0_4_;
    fVar143 = auVar11._4_4_;
    auVar24._4_4_ = fVar143 * fStack_8fc;
    auVar24._0_4_ = fVar131 * local_900;
    auVar24._8_4_ = fVar131 * fStack_8f8;
    auVar24._12_4_ = fVar143 * fStack_8f4;
    auVar24._16_4_ = fVar131 * fStack_8f0;
    auVar24._20_4_ = fVar143 * fStack_8ec;
    auVar24._24_4_ = fVar131 * fStack_8e8;
    auVar24._28_4_ = local_6a0._0_4_;
    auVar11 = vfmadd231ps_fma(auVar24,local_e0,auVar196);
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar121,local_c0);
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar140,local_a0);
    uStack_f8 = local_100;
    uStack_f0 = local_100;
    uStack_e8 = local_100;
    auVar25._4_4_ = fVar81 * fVar143;
    auVar25._0_4_ = fVar130 * fVar131;
    auVar25._8_4_ = fVar82 * fVar131;
    auVar25._12_4_ = fVar83 * fVar143;
    auVar25._16_4_ = fVar84 * fVar131;
    auVar25._20_4_ = fVar85 * fVar143;
    auVar25._24_4_ = fVar86 * fVar131;
    auVar25._28_4_ = auVar140._28_4_;
    auVar12 = vfmadd231ps_fma(auVar25,auVar124,local_e0);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar19,local_c0);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar190,local_a0);
    auVar26._4_4_ = fVar144 * fVar144;
    auVar26._0_4_ = fVar145 * fVar145;
    auVar26._8_4_ = fVar125 * fVar125;
    auVar26._12_4_ = fVar126 * fVar126;
    auVar26._16_4_ = fVar127 * fVar127;
    auVar26._20_4_ = fVar128 * fVar128;
    auVar26._24_4_ = fVar129 * fVar129;
    auVar26._28_4_ = auVar10._4_4_;
    auVar10 = vfmadd231ps_fma(auVar26,auVar123,auVar123);
    auVar199 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
    auVar27._4_4_ = auVar199._4_4_ * auVar199._4_4_ * auVar10._4_4_;
    auVar27._0_4_ = auVar199._0_4_ * auVar199._0_4_ * auVar10._0_4_;
    auVar27._8_4_ = auVar199._8_4_ * auVar199._8_4_ * auVar10._8_4_;
    auVar27._12_4_ = auVar199._12_4_ * auVar199._12_4_ * auVar10._12_4_;
    auVar27._16_4_ = auVar199._16_4_ * auVar199._16_4_ * 0.0;
    auVar27._20_4_ = auVar199._20_4_ * auVar199._20_4_ * 0.0;
    auVar27._24_4_ = auVar199._24_4_ * auVar199._24_4_ * 0.0;
    auVar27._28_4_ = auVar199._28_4_;
    auVar28._4_4_ = auVar18._4_4_ * auVar18._4_4_;
    auVar28._0_4_ = auVar18._0_4_ * auVar18._0_4_;
    auVar28._8_4_ = auVar18._8_4_ * auVar18._8_4_;
    auVar28._12_4_ = auVar18._12_4_ * auVar18._12_4_;
    auVar28._16_4_ = auVar18._16_4_ * auVar18._16_4_;
    auVar28._20_4_ = auVar18._20_4_ * auVar18._20_4_;
    auVar28._24_4_ = auVar18._24_4_ * auVar18._24_4_;
    auVar28._28_4_ = auVar18._28_4_;
    auVar199 = vcmpps_avx(auVar28,auVar27,2);
    fVar145 = auVar164._0_4_ * 4.7683716e-07;
    auVar117._0_4_ = (float)iVar98;
    local_600._4_12_ = auVar177._4_12_;
    local_600._0_4_ = auVar117._0_4_;
    local_600._16_16_ = auVar115._16_16_;
    auVar117._4_4_ = auVar117._0_4_;
    auVar117._8_4_ = auVar117._0_4_;
    auVar117._12_4_ = auVar117._0_4_;
    auVar117._16_4_ = auVar117._0_4_;
    auVar117._20_4_ = auVar117._0_4_;
    auVar117._24_4_ = auVar117._0_4_;
    auVar117._28_4_ = auVar117._0_4_;
    auVar115 = vcmpps_avx(_DAT_01f7b060,auVar117,1);
    auVar10 = vpermilps_avx(auVar112,0xaa);
    uVar132 = auVar10._0_8_;
    local_6a0._8_8_ = uVar132;
    local_6a0._0_8_ = uVar132;
    local_6a0._16_8_ = uVar132;
    local_6a0._24_8_ = uVar132;
    auVar164 = vpermilps_avx(auVar172,0xaa);
    uVar132 = auVar164._0_8_;
    auVar161._8_8_ = uVar132;
    auVar161._0_8_ = uVar132;
    auVar161._16_8_ = uVar132;
    auVar161._24_8_ = uVar132;
    auVar164 = vpermilps_avx(auVar160,0xaa);
    uVar132 = auVar164._0_8_;
    local_560._8_8_ = uVar132;
    local_560._0_8_ = uVar132;
    local_560._16_8_ = uVar132;
    local_560._24_8_ = uVar132;
    auVar164 = vshufps_avx(auVar177,auVar177,0xaa);
    uVar132 = auVar164._0_8_;
    register0x00001508 = uVar132;
    local_700 = uVar132;
    register0x00001510 = uVar132;
    register0x00001518 = uVar132;
    auVar210 = ZEXT3264(_local_700);
    auVar18 = auVar115 & auVar199;
    uVar5 = *(uint *)(ray + k * 4 + 0x60);
    local_720._0_16_ = ZEXT416(uVar5);
    local_580._0_16_ = ZEXT416((uint)local_5c0._4_4_);
    local_790 = auVar8._0_8_;
    uStack_788 = auVar8._8_8_;
    local_7a0 = auVar9._0_8_;
    uStack_798 = auVar9._8_8_;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar18 >> 0x7f,0) == '\0') &&
          (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar18 >> 0xbf,0) == '\0') &&
        (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar18[0x1f]) {
      uVar103 = 0;
      auVar188 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,CONCAT416(fVar206,
                                                  CONCAT412(fVar206,CONCAT48(fVar206,CONCAT44(
                                                  fVar206,fVar206))))))));
      auVar183 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar159,CONCAT420(fVar163,CONCAT416(fVar159,
                                                  CONCAT412(fVar163,CONCAT48(fVar159,uVar111)))))));
    }
    else {
      local_620 = SUB84(pGVar107,0);
      uStack_61c = (undefined4)((ulong)pGVar107 >> 0x20);
      _local_500 = vandps_avx(auVar199,auVar115);
      fVar131 = auVar164._0_4_;
      fVar143 = auVar164._4_4_;
      auVar29._4_4_ = fVar143 * fVar81;
      auVar29._0_4_ = fVar131 * fVar130;
      auVar29._8_4_ = fVar131 * fVar82;
      auVar29._12_4_ = fVar143 * fVar83;
      auVar29._16_4_ = fVar131 * fVar84;
      auVar29._20_4_ = fVar143 * fVar85;
      auVar29._24_4_ = fVar131 * fVar86;
      auVar29._28_4_ = local_500._28_4_;
      auVar164 = vfmadd213ps_fma(auVar124,local_560,auVar29);
      auVar164 = vfmadd213ps_fma(auVar19,auVar161,ZEXT1632(auVar164));
      auVar164 = vfmadd213ps_fma(auVar190,local_6a0,ZEXT1632(auVar164));
      local_5e0 = ZEXT1632(auVar164);
      auVar30._4_4_ = fVar143 * fStack_8fc;
      auVar30._0_4_ = fVar131 * local_900;
      auVar30._8_4_ = fVar131 * fStack_8f8;
      auVar30._12_4_ = fVar143 * fStack_8f4;
      auVar30._16_4_ = fVar131 * fStack_8f0;
      auVar30._20_4_ = fVar143 * fStack_8ec;
      auVar30._24_4_ = fVar131 * fStack_8e8;
      auVar30._28_4_ = local_500._28_4_;
      auVar164 = vfmadd213ps_fma(auVar196,local_560,auVar30);
      auVar164 = vfmadd213ps_fma(auVar121,auVar161,ZEXT1632(auVar164));
      auVar115 = *(undefined1 (*) [32])(bspline_basis0 + lVar109 + 0x1210);
      auVar196 = *(undefined1 (*) [32])(bspline_basis0 + lVar109 + 0x1694);
      auVar121 = *(undefined1 (*) [32])(bspline_basis0 + lVar109 + 0x1b18);
      fVar144 = *(float *)(bspline_basis0 + lVar109 + 0x1f9c);
      fVar125 = *(float *)(bspline_basis0 + lVar109 + 0x1fa0);
      fVar126 = *(float *)(bspline_basis0 + lVar109 + 0x1fa4);
      fVar127 = *(float *)(bspline_basis0 + lVar109 + 0x1fa8);
      fVar128 = *(float *)(bspline_basis0 + lVar109 + 0x1fac);
      fVar129 = *(float *)(bspline_basis0 + lVar109 + 0x1fb0);
      fVar130 = *(float *)(bspline_basis0 + lVar109 + 0x1fb4);
      auVar31._4_4_ = fVar206 * fVar125;
      auVar31._0_4_ = fVar206 * fVar144;
      auVar31._8_4_ = fVar206 * fVar126;
      auVar31._12_4_ = fVar206 * fVar127;
      auVar31._16_4_ = fVar206 * fVar128;
      auVar31._20_4_ = fVar206 * fVar129;
      auVar31._24_4_ = fVar206 * fVar130;
      auVar31._28_4_ = local_4e0._28_4_;
      auVar32._4_4_ = fVar163 * fVar125;
      auVar32._0_4_ = fVar159 * fVar144;
      auVar32._8_4_ = fVar159 * fVar126;
      auVar32._12_4_ = fVar163 * fVar127;
      auVar32._16_4_ = fVar159 * fVar128;
      auVar32._20_4_ = fVar163 * fVar129;
      auVar32._24_4_ = fVar159 * fVar130;
      auVar32._28_4_ = *(undefined4 *)(bspline_basis1 + lVar109 + 0xda8);
      auVar33._4_4_ = fVar143 * fVar125;
      auVar33._0_4_ = fVar131 * fVar144;
      auVar33._8_4_ = fVar131 * fVar126;
      auVar33._12_4_ = fVar143 * fVar127;
      auVar33._16_4_ = fVar131 * fVar128;
      auVar33._20_4_ = fVar143 * fVar129;
      auVar33._24_4_ = fVar131 * fVar130;
      auVar33._28_4_ = auVar123._28_4_;
      auVar13 = vfmadd231ps_fma(auVar31,auVar121,auVar152);
      auVar112 = vfmadd231ps_fma(auVar32,auVar121,auVar203);
      auVar172 = vfmadd231ps_fma(auVar33,local_560,auVar121);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar196,auVar198);
      auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar196,local_460);
      auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),auVar161,auVar196);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar115,auVar215);
      auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar115,local_5a0);
      auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),local_6a0,auVar115);
      fVar144 = *(float *)(bspline_basis1 + lVar109 + 0x1f9c);
      fVar125 = *(float *)(bspline_basis1 + lVar109 + 0x1fa0);
      fVar126 = *(float *)(bspline_basis1 + lVar109 + 0x1fa4);
      fVar127 = *(float *)(bspline_basis1 + lVar109 + 0x1fa8);
      fVar128 = *(float *)(bspline_basis1 + lVar109 + 0x1fac);
      fVar129 = *(float *)(bspline_basis1 + lVar109 + 0x1fb0);
      fVar130 = *(float *)(bspline_basis1 + lVar109 + 0x1fb4);
      auVar196._4_4_ = fVar206 * fVar125;
      auVar196._0_4_ = fVar206 * fVar144;
      auVar196._8_4_ = fVar206 * fVar126;
      auVar196._12_4_ = fVar206 * fVar127;
      auVar196._16_4_ = fVar206 * fVar128;
      auVar196._20_4_ = fVar206 * fVar129;
      auVar196._24_4_ = fVar206 * fVar130;
      auVar196._28_4_ = fVar206;
      auVar34._4_4_ = fVar163 * fVar125;
      auVar34._0_4_ = fVar159 * fVar144;
      auVar34._8_4_ = fVar159 * fVar126;
      auVar34._12_4_ = fVar163 * fVar127;
      auVar34._16_4_ = fVar159 * fVar128;
      auVar34._20_4_ = fVar163 * fVar129;
      auVar34._24_4_ = fVar159 * fVar130;
      auVar34._28_4_ = fVar163;
      auVar35._4_4_ = fVar125 * fVar143;
      auVar35._0_4_ = fVar144 * fVar131;
      auVar35._8_4_ = fVar126 * fVar131;
      auVar35._12_4_ = fVar127 * fVar143;
      auVar35._16_4_ = fVar128 * fVar131;
      auVar35._20_4_ = fVar129 * fVar143;
      auVar35._24_4_ = fVar130 * fVar131;
      auVar35._28_4_ = auVar10._4_4_;
      auVar115 = *(undefined1 (*) [32])(bspline_basis1 + lVar109 + 0x1b18);
      auVar10 = vfmadd231ps_fma(auVar196,auVar115,auVar152);
      auVar160 = vfmadd231ps_fma(auVar34,auVar115,auVar203);
      auVar177 = vfmadd231ps_fma(auVar35,auVar115,local_560);
      auVar115 = *(undefined1 (*) [32])(bspline_basis1 + lVar109 + 0x1694);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar115,auVar198);
      auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar115,local_460);
      auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar161,auVar115);
      auVar115 = *(undefined1 (*) [32])(bspline_basis1 + lVar109 + 0x1210);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar115,auVar215);
      auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar115,local_5a0);
      auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),local_6a0,auVar115);
      auVar115 = vandps_avx(local_420,ZEXT1632(auVar13));
      auVar196 = vandps_avx(ZEXT1632(auVar112),local_420);
      auVar196 = vmaxps_avx(auVar115,auVar196);
      auVar115 = vandps_avx(ZEXT1632(auVar172),local_420);
      auVar115 = vmaxps_avx(auVar196,auVar115);
      auVar137._4_4_ = fVar145;
      auVar137._0_4_ = fVar145;
      auVar137._8_4_ = fVar145;
      auVar137._12_4_ = fVar145;
      auVar137._16_4_ = fVar145;
      auVar137._20_4_ = fVar145;
      auVar137._24_4_ = fVar145;
      auVar137._28_4_ = fVar145;
      auVar115 = vcmpps_avx(auVar115,auVar137,1);
      auVar121 = vblendvps_avx(ZEXT1632(auVar13),auVar123,auVar115);
      auVar124 = vblendvps_avx(ZEXT1632(auVar112),local_4e0,auVar115);
      auVar115 = vandps_avx(ZEXT1632(auVar10),local_420);
      auVar196 = vandps_avx(ZEXT1632(auVar160),local_420);
      auVar196 = vmaxps_avx(auVar115,auVar196);
      auVar115 = vandps_avx(ZEXT1632(auVar177),local_420);
      auVar115 = vmaxps_avx(auVar196,auVar115);
      auVar196 = vcmpps_avx(auVar115,auVar137,1);
      auVar115 = vblendvps_avx(ZEXT1632(auVar10),auVar123,auVar196);
      auVar196 = vblendvps_avx(ZEXT1632(auVar160),local_4e0,auVar196);
      auVar164 = vfmadd213ps_fma(auVar140,local_6a0,ZEXT1632(auVar164));
      auVar10 = vfmadd213ps_fma(auVar121,auVar121,ZEXT832(0) << 0x20);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar124,auVar124);
      auVar140 = vrsqrtps_avx(ZEXT1632(auVar10));
      fVar144 = auVar140._0_4_;
      fVar125 = auVar140._4_4_;
      fVar126 = auVar140._8_4_;
      fVar127 = auVar140._12_4_;
      fVar128 = auVar140._16_4_;
      fVar129 = auVar140._20_4_;
      fVar130 = auVar140._24_4_;
      auVar36._4_4_ = fVar125 * fVar125 * fVar125 * auVar10._4_4_ * -0.5;
      auVar36._0_4_ = fVar144 * fVar144 * fVar144 * auVar10._0_4_ * -0.5;
      auVar36._8_4_ = fVar126 * fVar126 * fVar126 * auVar10._8_4_ * -0.5;
      auVar36._12_4_ = fVar127 * fVar127 * fVar127 * auVar10._12_4_ * -0.5;
      auVar36._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
      auVar36._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
      auVar36._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
      auVar36._28_4_ = 0;
      auVar214._8_4_ = 0x3fc00000;
      auVar214._0_8_ = 0x3fc000003fc00000;
      auVar214._12_4_ = 0x3fc00000;
      auVar214._16_4_ = 0x3fc00000;
      auVar214._20_4_ = 0x3fc00000;
      auVar214._24_4_ = 0x3fc00000;
      auVar214._28_4_ = 0x3fc00000;
      auVar10 = vfmadd231ps_fma(auVar36,auVar214,auVar140);
      fVar144 = auVar10._0_4_;
      fVar125 = auVar10._4_4_;
      auVar37._4_4_ = auVar124._4_4_ * fVar125;
      auVar37._0_4_ = auVar124._0_4_ * fVar144;
      fVar126 = auVar10._8_4_;
      auVar37._8_4_ = auVar124._8_4_ * fVar126;
      fVar127 = auVar10._12_4_;
      auVar37._12_4_ = auVar124._12_4_ * fVar127;
      auVar37._16_4_ = auVar124._16_4_ * 0.0;
      auVar37._20_4_ = auVar124._20_4_ * 0.0;
      auVar37._24_4_ = auVar124._24_4_ * 0.0;
      auVar37._28_4_ = auVar140._28_4_;
      auVar38._4_4_ = -auVar121._4_4_ * fVar125;
      auVar38._0_4_ = -auVar121._0_4_ * fVar144;
      auVar38._8_4_ = -auVar121._8_4_ * fVar126;
      auVar38._12_4_ = -auVar121._12_4_ * fVar127;
      auVar38._16_4_ = -auVar121._16_4_ * 0.0;
      auVar38._20_4_ = -auVar121._20_4_ * 0.0;
      auVar38._24_4_ = -auVar121._24_4_ * 0.0;
      auVar38._28_4_ = 0;
      auVar10 = vfmadd213ps_fma(auVar115,auVar115,ZEXT832(0) << 0x20);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar196,auVar196);
      auVar121 = vrsqrtps_avx(ZEXT1632(auVar10));
      auVar140 = ZEXT1632(CONCAT412(fVar127 * 0.0,
                                    CONCAT48(fVar126 * 0.0,CONCAT44(fVar125 * 0.0,fVar144 * 0.0))));
      fVar144 = auVar121._0_4_;
      fVar125 = auVar121._4_4_;
      fVar126 = auVar121._8_4_;
      fVar127 = auVar121._12_4_;
      fVar128 = auVar121._16_4_;
      fVar129 = auVar121._20_4_;
      fVar130 = auVar121._24_4_;
      auVar39._4_4_ = fVar125 * fVar125 * fVar125 * auVar10._4_4_ * -0.5;
      auVar39._0_4_ = fVar144 * fVar144 * fVar144 * auVar10._0_4_ * -0.5;
      auVar39._8_4_ = fVar126 * fVar126 * fVar126 * auVar10._8_4_ * -0.5;
      auVar39._12_4_ = fVar127 * fVar127 * fVar127 * auVar10._12_4_ * -0.5;
      auVar39._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
      auVar39._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
      auVar39._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
      auVar39._28_4_ = 0xbf000000;
      auVar10 = vfmadd231ps_fma(auVar39,auVar214,auVar121);
      fVar144 = auVar10._0_4_;
      fVar125 = auVar10._4_4_;
      auVar40._4_4_ = fVar125 * auVar196._4_4_;
      auVar40._0_4_ = fVar144 * auVar196._0_4_;
      fVar126 = auVar10._8_4_;
      auVar40._8_4_ = fVar126 * auVar196._8_4_;
      fVar127 = auVar10._12_4_;
      auVar40._12_4_ = fVar127 * auVar196._12_4_;
      auVar40._16_4_ = auVar196._16_4_ * 0.0;
      auVar40._20_4_ = auVar196._20_4_ * 0.0;
      auVar40._24_4_ = auVar196._24_4_ * 0.0;
      auVar40._28_4_ = 0;
      auVar41._4_4_ = fVar125 * -auVar115._4_4_;
      auVar41._0_4_ = fVar144 * -auVar115._0_4_;
      auVar41._8_4_ = fVar126 * -auVar115._8_4_;
      auVar41._12_4_ = fVar127 * -auVar115._12_4_;
      auVar41._16_4_ = -auVar115._16_4_ * 0.0;
      auVar41._20_4_ = -auVar115._20_4_ * 0.0;
      auVar41._24_4_ = -auVar115._24_4_ * 0.0;
      auVar41._28_4_ = 0x3fc00000;
      auVar42._28_4_ = auVar121._28_4_;
      auVar42._0_28_ =
           ZEXT1628(CONCAT412(fVar127 * 0.0,
                              CONCAT48(fVar126 * 0.0,CONCAT44(fVar125 * 0.0,fVar144 * 0.0))));
      auVar10 = vfmadd213ps_fma(auVar37,ZEXT1632(auVar11),auVar135);
      auVar115 = ZEXT1632(auVar11);
      auVar13 = vfmadd213ps_fma(auVar38,auVar115,local_4c0);
      auVar112 = vfmadd213ps_fma(auVar140,auVar115,ZEXT1632(auVar164));
      auVar177 = vfnmadd213ps_fma(auVar37,auVar115,auVar135);
      auVar172 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar12),_local_480);
      auVar133 = vfnmadd213ps_fma(auVar38,auVar115,local_4c0);
      auVar187 = ZEXT1632(auVar12);
      auVar12 = vfmadd213ps_fma(auVar41,auVar187,_local_4a0);
      auVar180 = ZEXT1632(auVar11);
      auVar185 = vfnmadd231ps_fma(ZEXT1632(auVar164),auVar180,auVar140);
      auVar11 = vfmadd213ps_fma(auVar42,auVar187,local_5e0);
      auVar178 = vfnmadd213ps_fma(auVar40,auVar187,_local_480);
      auVar184 = vfnmadd213ps_fma(auVar41,auVar187,_local_4a0);
      auVar193 = vfnmadd231ps_fma(local_5e0,auVar187,auVar42);
      auVar115 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar133));
      auVar196 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar185));
      auVar153._0_4_ = auVar185._0_4_ * auVar115._0_4_;
      auVar153._4_4_ = auVar185._4_4_ * auVar115._4_4_;
      auVar153._8_4_ = auVar185._8_4_ * auVar115._8_4_;
      auVar153._12_4_ = auVar185._12_4_ * auVar115._12_4_;
      auVar153._16_4_ = auVar115._16_4_ * 0.0;
      auVar153._20_4_ = auVar115._20_4_ * 0.0;
      auVar153._24_4_ = auVar115._24_4_ * 0.0;
      auVar153._28_4_ = 0;
      auVar160 = vfmsub231ps_fma(auVar153,ZEXT1632(auVar133),auVar196);
      auVar43._4_4_ = auVar177._4_4_ * auVar196._4_4_;
      auVar43._0_4_ = auVar177._0_4_ * auVar196._0_4_;
      auVar43._8_4_ = auVar177._8_4_ * auVar196._8_4_;
      auVar43._12_4_ = auVar177._12_4_ * auVar196._12_4_;
      auVar43._16_4_ = auVar196._16_4_ * 0.0;
      auVar43._20_4_ = auVar196._20_4_ * 0.0;
      auVar43._24_4_ = auVar196._24_4_ * 0.0;
      auVar43._28_4_ = auVar196._28_4_;
      auVar190 = ZEXT1632(auVar177);
      auVar196 = vsubps_avx(ZEXT1632(auVar172),auVar190);
      auVar164 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar185),auVar196);
      auVar44._4_4_ = auVar133._4_4_ * auVar196._4_4_;
      auVar44._0_4_ = auVar133._0_4_ * auVar196._0_4_;
      auVar44._8_4_ = auVar133._8_4_ * auVar196._8_4_;
      auVar44._12_4_ = auVar133._12_4_ * auVar196._12_4_;
      auVar44._16_4_ = auVar196._16_4_ * 0.0;
      auVar44._20_4_ = auVar196._20_4_ * 0.0;
      auVar44._24_4_ = auVar196._24_4_ * 0.0;
      auVar44._28_4_ = auVar196._28_4_;
      auVar177 = vfmsub231ps_fma(auVar44,auVar190,auVar115);
      auVar164 = vfmadd231ps_fma(ZEXT1632(auVar177),ZEXT832(0) << 0x20,ZEXT1632(auVar164));
      auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),ZEXT832(0) << 0x20,ZEXT1632(auVar160));
      auVar18 = vcmpps_avx(ZEXT1632(auVar164),ZEXT832(0) << 0x20,2);
      auVar115 = vblendvps_avx(ZEXT1632(auVar178),ZEXT1632(auVar10),auVar18);
      auVar196 = vblendvps_avx(ZEXT1632(auVar184),ZEXT1632(auVar13),auVar18);
      auVar121 = vblendvps_avx(ZEXT1632(auVar193),ZEXT1632(auVar112),auVar18);
      auVar140 = vblendvps_avx(auVar190,ZEXT1632(auVar172),auVar18);
      auVar124 = vblendvps_avx(ZEXT1632(auVar133),ZEXT1632(auVar12),auVar18);
      auVar19 = vblendvps_avx(ZEXT1632(auVar185),ZEXT1632(auVar11),auVar18);
      auVar190 = vblendvps_avx(ZEXT1632(auVar172),auVar190,auVar18);
      auVar199 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar133),auVar18);
      auVar164 = vpackssdw_avx(local_500._0_16_,local_500._16_16_);
      auVar123 = vblendvps_avx(ZEXT1632(auVar11),ZEXT1632(auVar185),auVar18);
      auVar135 = vsubps_avx(auVar190,auVar115);
      auVar134 = vsubps_avx(auVar199,auVar196);
      auVar151 = vsubps_avx(auVar123,auVar121);
      auVar199 = vsubps_avx(auVar115,auVar140);
      auVar173 = vsubps_avx(auVar196,auVar124);
      auVar186 = vsubps_avx(auVar121,auVar19);
      auVar45._4_4_ = auVar151._4_4_ * auVar115._4_4_;
      auVar45._0_4_ = auVar151._0_4_ * auVar115._0_4_;
      auVar45._8_4_ = auVar151._8_4_ * auVar115._8_4_;
      auVar45._12_4_ = auVar151._12_4_ * auVar115._12_4_;
      auVar45._16_4_ = auVar151._16_4_ * auVar115._16_4_;
      auVar45._20_4_ = auVar151._20_4_ * auVar115._20_4_;
      auVar45._24_4_ = auVar151._24_4_ * auVar115._24_4_;
      auVar45._28_4_ = auVar123._28_4_;
      auVar10 = vfmsub231ps_fma(auVar45,auVar121,auVar135);
      auVar46._4_4_ = auVar135._4_4_ * auVar196._4_4_;
      auVar46._0_4_ = auVar135._0_4_ * auVar196._0_4_;
      auVar46._8_4_ = auVar135._8_4_ * auVar196._8_4_;
      auVar46._12_4_ = auVar135._12_4_ * auVar196._12_4_;
      auVar46._16_4_ = auVar135._16_4_ * auVar196._16_4_;
      auVar46._20_4_ = auVar135._20_4_ * auVar196._20_4_;
      auVar46._24_4_ = auVar135._24_4_ * auVar196._24_4_;
      auVar46._28_4_ = auVar190._28_4_;
      auVar11 = vfmsub231ps_fma(auVar46,auVar115,auVar134);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
      auVar118._0_4_ = auVar134._0_4_ * auVar121._0_4_;
      auVar118._4_4_ = auVar134._4_4_ * auVar121._4_4_;
      auVar118._8_4_ = auVar134._8_4_ * auVar121._8_4_;
      auVar118._12_4_ = auVar134._12_4_ * auVar121._12_4_;
      auVar118._16_4_ = auVar134._16_4_ * auVar121._16_4_;
      auVar118._20_4_ = auVar134._20_4_ * auVar121._20_4_;
      auVar118._24_4_ = auVar134._24_4_ * auVar121._24_4_;
      auVar118._28_4_ = 0;
      auVar11 = vfmsub231ps_fma(auVar118,auVar196,auVar151);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
      auVar119._0_4_ = auVar186._0_4_ * auVar140._0_4_;
      auVar119._4_4_ = auVar186._4_4_ * auVar140._4_4_;
      auVar119._8_4_ = auVar186._8_4_ * auVar140._8_4_;
      auVar119._12_4_ = auVar186._12_4_ * auVar140._12_4_;
      auVar119._16_4_ = auVar186._16_4_ * auVar140._16_4_;
      auVar119._20_4_ = auVar186._20_4_ * auVar140._20_4_;
      auVar119._24_4_ = auVar186._24_4_ * auVar140._24_4_;
      auVar119._28_4_ = 0;
      auVar10 = vfmsub231ps_fma(auVar119,auVar199,auVar19);
      auVar47._4_4_ = auVar173._4_4_ * auVar19._4_4_;
      auVar47._0_4_ = auVar173._0_4_ * auVar19._0_4_;
      auVar47._8_4_ = auVar173._8_4_ * auVar19._8_4_;
      auVar47._12_4_ = auVar173._12_4_ * auVar19._12_4_;
      auVar47._16_4_ = auVar173._16_4_ * auVar19._16_4_;
      auVar47._20_4_ = auVar173._20_4_ * auVar19._20_4_;
      auVar47._24_4_ = auVar173._24_4_ * auVar19._24_4_;
      auVar47._28_4_ = auVar19._28_4_;
      auVar12 = vfmsub231ps_fma(auVar47,auVar124,auVar186);
      auVar48._4_4_ = auVar199._4_4_ * auVar124._4_4_;
      auVar48._0_4_ = auVar199._0_4_ * auVar124._0_4_;
      auVar48._8_4_ = auVar199._8_4_ * auVar124._8_4_;
      auVar48._12_4_ = auVar199._12_4_ * auVar124._12_4_;
      auVar48._16_4_ = auVar199._16_4_ * auVar124._16_4_;
      auVar48._20_4_ = auVar199._20_4_ * auVar124._20_4_;
      auVar48._24_4_ = auVar199._24_4_ * auVar124._24_4_;
      auVar48._28_4_ = auVar124._28_4_;
      auVar13 = vfmsub231ps_fma(auVar48,auVar173,auVar140);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
      auVar140 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
      auVar140 = vcmpps_avx(auVar140,ZEXT832(0) << 0x20,2);
      auVar10 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
      auVar164 = vpand_avx(auVar164,auVar10);
      auVar140 = vpmovsxwd_avx2(auVar164);
      if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar140 >> 0x7f,0) == '\0') &&
            (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar140 >> 0xbf,0) == '\0') &&
          (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar140[0x1f]) {
        auVar200 = ZEXT864(0) << 0x20;
LAB_01302f97:
        auVar188 = ZEXT3264(CONCAT824(uStack_628,
                                      CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
        auVar115 = vpcmpeqd_avx2(auVar199,auVar199);
        auVar158 = ZEXT3264(auVar115);
      }
      else {
        auVar49._4_4_ = auVar134._4_4_ * auVar186._4_4_;
        auVar49._0_4_ = auVar134._0_4_ * auVar186._0_4_;
        auVar49._8_4_ = auVar134._8_4_ * auVar186._8_4_;
        auVar49._12_4_ = auVar134._12_4_ * auVar186._12_4_;
        auVar49._16_4_ = auVar134._16_4_ * auVar186._16_4_;
        auVar49._20_4_ = auVar134._20_4_ * auVar186._20_4_;
        auVar49._24_4_ = auVar134._24_4_ * auVar186._24_4_;
        auVar49._28_4_ = auVar140._28_4_;
        auVar172 = vfmsub231ps_fma(auVar49,auVar173,auVar151);
        auVar138._0_4_ = auVar199._0_4_ * auVar151._0_4_;
        auVar138._4_4_ = auVar199._4_4_ * auVar151._4_4_;
        auVar138._8_4_ = auVar199._8_4_ * auVar151._8_4_;
        auVar138._12_4_ = auVar199._12_4_ * auVar151._12_4_;
        auVar138._16_4_ = auVar199._16_4_ * auVar151._16_4_;
        auVar138._20_4_ = auVar199._20_4_ * auVar151._20_4_;
        auVar138._24_4_ = auVar199._24_4_ * auVar151._24_4_;
        auVar138._28_4_ = 0;
        auVar112 = vfmsub231ps_fma(auVar138,auVar135,auVar186);
        auVar50._4_4_ = auVar135._4_4_ * auVar173._4_4_;
        auVar50._0_4_ = auVar135._0_4_ * auVar173._0_4_;
        auVar50._8_4_ = auVar135._8_4_ * auVar173._8_4_;
        auVar50._12_4_ = auVar135._12_4_ * auVar173._12_4_;
        auVar50._16_4_ = auVar135._16_4_ * auVar173._16_4_;
        auVar50._20_4_ = auVar135._20_4_ * auVar173._20_4_;
        auVar50._24_4_ = auVar135._24_4_ * auVar173._24_4_;
        auVar50._28_4_ = auVar135._28_4_;
        auVar160 = vfmsub231ps_fma(auVar50,auVar199,auVar134);
        auVar10 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar112),ZEXT1632(auVar160));
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar172),_DAT_01f7b000);
        auVar199 = vrcpps_avx(ZEXT1632(auVar13));
        auVar204._8_4_ = 0x3f800000;
        auVar204._0_8_ = 0x3f8000003f800000;
        auVar204._12_4_ = 0x3f800000;
        auVar204._16_4_ = 0x3f800000;
        auVar204._20_4_ = 0x3f800000;
        auVar204._24_4_ = 0x3f800000;
        auVar204._28_4_ = 0x3f800000;
        auVar10 = vfnmadd213ps_fma(auVar199,ZEXT1632(auVar13),auVar204);
        auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar199,auVar199);
        auVar51._4_4_ = auVar160._4_4_ * auVar121._4_4_;
        auVar51._0_4_ = auVar160._0_4_ * auVar121._0_4_;
        auVar51._8_4_ = auVar160._8_4_ * auVar121._8_4_;
        auVar51._12_4_ = auVar160._12_4_ * auVar121._12_4_;
        auVar51._16_4_ = auVar121._16_4_ * 0.0;
        auVar51._20_4_ = auVar121._20_4_ * 0.0;
        auVar51._24_4_ = auVar121._24_4_ * 0.0;
        auVar51._28_4_ = auVar121._28_4_;
        auVar112 = vfmadd231ps_fma(auVar51,auVar196,ZEXT1632(auVar112));
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),ZEXT1632(auVar172),auVar115);
        fVar144 = auVar10._0_4_;
        fVar125 = auVar10._4_4_;
        fVar126 = auVar10._8_4_;
        fVar127 = auVar10._12_4_;
        auVar52._28_4_ = auVar196._28_4_;
        auVar52._0_28_ =
             ZEXT1628(CONCAT412(fVar127 * auVar112._12_4_,
                                CONCAT48(fVar126 * auVar112._8_4_,
                                         CONCAT44(fVar125 * auVar112._4_4_,fVar144 * auVar112._0_4_)
                                        )));
        auVar120._4_4_ = uVar5;
        auVar120._0_4_ = uVar5;
        auVar120._8_4_ = uVar5;
        auVar120._12_4_ = uVar5;
        auVar120._16_4_ = uVar5;
        auVar120._20_4_ = uVar5;
        auVar120._24_4_ = uVar5;
        auVar120._28_4_ = uVar5;
        uVar99 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar139._4_4_ = uVar99;
        auVar139._0_4_ = uVar99;
        auVar139._8_4_ = uVar99;
        auVar139._12_4_ = uVar99;
        auVar139._16_4_ = uVar99;
        auVar139._20_4_ = uVar99;
        auVar139._24_4_ = uVar99;
        auVar139._28_4_ = uVar99;
        auVar115 = vcmpps_avx(auVar120,auVar52,2);
        auVar196 = vcmpps_avx(auVar52,auVar139,2);
        auVar115 = vandps_avx(auVar196,auVar115);
        auVar10 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
        auVar164 = vpand_avx(auVar164,auVar10);
        auVar115 = vpmovsxwd_avx2(auVar164);
        auVar200 = ZEXT864(0) << 0x20;
        if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar115 >> 0x7f,0) == '\0') &&
              (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar115 >> 0xbf,0) == '\0') &&
            (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar115[0x1f]) goto LAB_01302f97;
        auVar115 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar13),4);
        auVar10 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
        auVar164 = vpand_avx(auVar164,auVar10);
        auVar196 = vpmovsxwd_avx2(auVar164);
        auVar188 = ZEXT3264(CONCAT824(uStack_628,
                                      CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
        auVar115 = vpcmpeqd_avx2(auVar199,auVar199);
        auVar158 = ZEXT3264(auVar115);
        if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar196 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar196 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar196 >> 0x7f,0) != '\0') ||
              (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar196 >> 0xbf,0) != '\0') ||
            (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar196[0x1f] < '\0') {
          auVar121 = ZEXT1632(CONCAT412(fVar127 * auVar11._12_4_,
                                        CONCAT48(fVar126 * auVar11._8_4_,
                                                 CONCAT44(fVar125 * auVar11._4_4_,
                                                          fVar144 * auVar11._0_4_))));
          auVar140 = ZEXT1632(CONCAT412(fVar127 * auVar12._12_4_,
                                        CONCAT48(fVar126 * auVar12._8_4_,
                                                 CONCAT44(fVar125 * auVar12._4_4_,
                                                          fVar144 * auVar12._0_4_))));
          auVar170._8_4_ = 0x3f800000;
          auVar170._0_8_ = 0x3f8000003f800000;
          auVar170._12_4_ = 0x3f800000;
          auVar170._16_4_ = 0x3f800000;
          auVar170._20_4_ = 0x3f800000;
          auVar170._24_4_ = 0x3f800000;
          auVar170._28_4_ = 0x3f800000;
          auVar115 = vsubps_avx(auVar170,auVar121);
          _local_3e0 = vblendvps_avx(auVar115,auVar121,auVar18);
          auVar115 = vsubps_avx(auVar170,auVar140);
          local_520 = vblendvps_avx(auVar115,auVar140,auVar18);
          auVar188 = ZEXT3264(auVar196);
          local_400 = auVar52;
        }
      }
      auVar197 = ZEXT3264(auVar161);
      auVar210 = ZEXT3264(_local_700);
      auVar115 = auVar188._0_32_;
      if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar115 >> 0x7f,0) == '\0') &&
            (auVar188 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar115 >> 0xbf,0) == '\0') &&
          (auVar188 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar188[0x1f]) {
        auVar188 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,CONCAT416(fVar206,
                                                  CONCAT412(fVar206,CONCAT48(fVar206,CONCAT44(
                                                  fVar206,fVar206))))))));
      }
      else {
        auVar196 = vsubps_avx(auVar187,auVar180);
        auVar164 = vfmadd213ps_fma(auVar196,_local_3e0,auVar180);
        fVar144 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar53._4_4_ = (auVar164._4_4_ + auVar164._4_4_) * fVar144;
        auVar53._0_4_ = (auVar164._0_4_ + auVar164._0_4_) * fVar144;
        auVar53._8_4_ = (auVar164._8_4_ + auVar164._8_4_) * fVar144;
        auVar53._12_4_ = (auVar164._12_4_ + auVar164._12_4_) * fVar144;
        auVar53._16_4_ = fVar144 * 0.0;
        auVar53._20_4_ = fVar144 * 0.0;
        auVar53._24_4_ = fVar144 * 0.0;
        auVar53._28_4_ = 0;
        auVar196 = vcmpps_avx(local_400,auVar53,6);
        auVar121 = auVar115 & auVar196;
        auVar188 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,CONCAT416(fVar206,
                                                  CONCAT412(fVar206,CONCAT48(fVar206,CONCAT44(
                                                  fVar206,fVar206))))))));
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0x7f,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar121 >> 0xbf,0) != '\0') ||
            (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar121[0x1f] < '\0') {
          auVar141._8_4_ = 0xbf800000;
          auVar141._0_8_ = 0xbf800000bf800000;
          auVar141._12_4_ = 0xbf800000;
          auVar141._16_4_ = 0xbf800000;
          auVar141._20_4_ = 0xbf800000;
          auVar141._24_4_ = 0xbf800000;
          auVar141._28_4_ = 0xbf800000;
          auVar154._8_4_ = 0x40000000;
          auVar154._0_8_ = 0x4000000040000000;
          auVar154._12_4_ = 0x40000000;
          auVar154._16_4_ = 0x40000000;
          auVar154._20_4_ = 0x40000000;
          auVar154._24_4_ = 0x40000000;
          auVar154._28_4_ = 0x40000000;
          auVar164 = vfmadd213ps_fma(local_520,auVar154,auVar141);
          local_3c0 = _local_3e0;
          local_3a0 = ZEXT1632(auVar164);
          local_380 = local_400;
          local_360 = 0;
          local_340 = local_790;
          uStack_338 = uStack_788;
          local_330 = local_7a0;
          uStack_328 = uStack_798;
          local_520 = local_3a0;
          if ((pGVar107->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            uVar103 = 0;
            auVar183 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar159,CONCAT420(fVar163,CONCAT416(
                                                  fVar159,CONCAT412(fVar163,CONCAT48(fVar159,uVar111
                                                                                    )))))));
          }
          else {
            auVar183 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar159,CONCAT420(fVar163,CONCAT416(
                                                  fVar159,CONCAT412(fVar163,CONCAT48(fVar159,uVar111
                                                                                    )))))));
            pGVar101 = (Geometry *)context->args;
            if ((((Geometry *)context->args)->device != (Device *)0x0) ||
               (uVar103 = CONCAT71((int7)((ulong)pGVar107 >> 8),1), pGVar101 = pGVar107,
               pGVar107->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar115 = vandps_avx(auVar196,auVar115);
              fVar144 = 1.0 / auVar117._0_4_;
              local_2e0[0] = fVar144 * ((float)local_3e0._0_4_ + 0.0);
              local_2e0[1] = fVar144 * ((float)local_3e0._4_4_ + 1.0);
              local_2e0[2] = fVar144 * (fStack_3d8 + 2.0);
              local_2e0[3] = fVar144 * (fStack_3d4 + 3.0);
              fStack_2d0 = fVar144 * (fStack_3d0 + 4.0);
              fStack_2cc = fVar144 * (fStack_3cc + 5.0);
              fStack_2c8 = fVar144 * (fStack_3c8 + 6.0);
              fStack_2c4 = fStack_3c4 + 7.0;
              local_520._0_8_ = auVar164._0_8_;
              local_520._8_8_ = auVar164._8_8_;
              local_2c0 = local_520._0_8_;
              uStack_2b8 = local_520._8_8_;
              uStack_2b0 = 0;
              uStack_2a8 = 0;
              local_2a0 = local_400;
              uVar99 = vmovmskps_avx(auVar115);
              uVar103 = 0;
              uVar105 = CONCAT44((int)((ulong)pGVar101 >> 0x20),uVar99);
              for (uVar20 = uVar105; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                uVar103 = uVar103 + 1;
              }
              local_740._4_4_ = uVar104;
              local_740._0_4_ = uVar104;
              local_740._8_4_ = uVar104;
              local_740._12_4_ = uVar104;
              local_740._16_4_ = uVar104;
              local_740._20_4_ = uVar104;
              local_740._24_4_ = uVar104;
              local_740._28_4_ = uVar104;
              local_5c0._0_4_ = local_5c0._4_4_;
              local_5c0._8_4_ = local_5c0._4_4_;
              local_5c0._12_4_ = local_5c0._4_4_;
              local_5c0._16_4_ = local_5c0._4_4_;
              local_5c0._20_4_ = local_5c0._4_4_;
              local_5c0._24_4_ = local_5c0._4_4_;
              local_5c0._28_4_ = local_5c0._4_4_;
              local_6e0 = auVar161;
              local_35c = iVar98;
              local_350 = uVar171;
              uStack_348 = uVar92;
              while (auVar161 = auVar197._0_32_, uVar105 != 0) {
                uVar99 = *(undefined4 *)(ray + k * 4 + 0x100);
                fVar144 = local_2e0[uVar103];
                auVar113._4_4_ = fVar144;
                auVar113._0_4_ = fVar144;
                auVar113._8_4_ = fVar144;
                auVar113._12_4_ = fVar144;
                local_220._16_4_ = fVar144;
                local_220._0_16_ = auVar113;
                local_220._20_4_ = fVar144;
                local_220._24_4_ = fVar144;
                local_220._28_4_ = fVar144;
                local_200 = *(undefined4 *)((long)&local_2c0 + uVar103 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar103 * 4);
                fVar126 = 1.0 - fVar144;
                auVar164 = ZEXT416((uint)(fVar144 * fVar126 * 4.0));
                auVar10 = vfnmsub213ss_fma(auVar113,auVar113,auVar164);
                auVar164 = vfmadd213ss_fma(ZEXT416((uint)fVar126),ZEXT416((uint)fVar126),auVar164);
                fVar125 = auVar164._0_4_ * 0.5;
                fVar144 = fVar144 * fVar144 * 0.5;
                auVar165._0_4_ = fVar144 * (float)local_660._0_4_;
                auVar165._4_4_ = fVar144 * (float)local_660._4_4_;
                auVar165._8_4_ = fVar144 * fStack_658;
                auVar165._12_4_ = fVar144 * fStack_654;
                auVar146._4_4_ = fVar125;
                auVar146._0_4_ = fVar125;
                auVar146._8_4_ = fVar125;
                auVar146._12_4_ = fVar125;
                auVar164 = vfmadd132ps_fma(auVar146,auVar165,auVar9);
                fVar144 = auVar10._0_4_ * 0.5;
                auVar166._4_4_ = fVar144;
                auVar166._0_4_ = fVar144;
                auVar166._8_4_ = fVar144;
                auVar166._12_4_ = fVar144;
                auVar164 = vfmadd132ps_fma(auVar166,auVar164,auVar8);
                local_770.context = context->user;
                fVar144 = fVar126 * -fVar126 * 0.5;
                auVar147._4_4_ = fVar144;
                auVar147._0_4_ = fVar144;
                auVar147._8_4_ = fVar144;
                auVar147._12_4_ = fVar144;
                auVar10 = vfmadd132ps_fma(auVar147,auVar164,auVar167);
                local_280 = auVar10._0_4_;
                uStack_27c = local_280;
                uStack_278 = local_280;
                uStack_274 = local_280;
                uStack_270 = local_280;
                uStack_26c = local_280;
                uStack_268 = local_280;
                uStack_264 = local_280;
                auVar164 = vmovshdup_avx(auVar10);
                local_260 = auVar164._0_8_;
                uStack_258 = local_260;
                uStack_250 = local_260;
                uStack_248 = local_260;
                auVar164 = vshufps_avx(auVar10,auVar10,0xaa);
                local_240._8_8_ = auVar164._0_8_;
                local_240._0_8_ = local_240._8_8_;
                local_240._16_8_ = local_240._8_8_;
                local_240._24_8_ = local_240._8_8_;
                uStack_1fc = local_200;
                uStack_1f8 = local_200;
                uStack_1f4 = local_200;
                uStack_1f0 = local_200;
                uStack_1ec = local_200;
                uStack_1e8 = local_200;
                uStack_1e4 = local_200;
                local_1e0 = local_5c0._0_8_;
                uStack_1d8 = local_5c0._8_8_;
                uStack_1d0 = local_5c0._16_8_;
                uStack_1c8 = local_5c0._24_8_;
                local_1c0 = local_740._0_8_;
                uStack_1b8 = local_740._8_8_;
                uStack_1b0 = local_740._16_8_;
                uStack_1a8 = local_740._24_8_;
                local_1a0 = (local_770.context)->instID[0];
                uStack_19c = local_1a0;
                uStack_198 = local_1a0;
                uStack_194 = local_1a0;
                uStack_190 = local_1a0;
                uStack_18c = local_1a0;
                uStack_188 = local_1a0;
                uStack_184 = local_1a0;
                local_180 = (local_770.context)->instPrimID[0];
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_680 = local_440;
                local_770.valid = (int *)local_680;
                local_770.geometryUserPtr = *(void **)(CONCAT44(uStack_61c,local_620) + 0x18);
                local_770.hit = (RTCHitN *)&local_280;
                local_770.N = 8;
                pcVar15 = *(code **)(CONCAT44(uStack_61c,local_620) + 0x48);
                local_770.ray = (RTCRayN *)ray;
                if (pcVar15 != (code *)0x0) {
                  auVar115 = ZEXT1632(auVar158._0_16_);
                  (*pcVar15)(&local_770);
                  auVar210 = ZEXT3264(_local_700);
                  auVar197 = ZEXT3264(local_6e0);
                  auVar188 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,
                                                  CONCAT416(fVar206,CONCAT412(fVar206,CONCAT48(
                                                  fVar206,CONCAT44(fVar206,fVar206))))))));
                  auVar115 = vpcmpeqd_avx2(auVar115,auVar115);
                  auVar158 = ZEXT3264(auVar115);
                  auVar200 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                auVar196 = vpcmpeqd_avx2(auVar200._0_32_,local_680);
                auVar115 = auVar158._0_32_ & ~auVar196;
                if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar115 >> 0x7f,0) == '\0') &&
                      (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar115 >> 0xbf,0) == '\0') &&
                    (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar115[0x1f]) {
                  auVar196 = auVar158._0_32_ ^ auVar196;
                  auVar183 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar159,CONCAT420(fVar163,
                                                  CONCAT416(fVar159,CONCAT412(fVar163,CONCAT48(
                                                  fVar159,uVar111)))))));
                }
                else {
                  p_Var16 = context->args->filter;
                  if (p_Var16 == (RTCFilterFunctionN)0x0) {
                    auVar183 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar159,CONCAT420(fVar163,
                                                  CONCAT416(fVar159,CONCAT412(fVar163,CONCAT48(
                                                  fVar159,uVar111)))))));
                  }
                  else {
                    auVar183 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar159,CONCAT420(fVar163,
                                                  CONCAT416(fVar159,CONCAT412(fVar163,CONCAT48(
                                                  fVar159,uVar111)))))));
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       ((*(byte *)(CONCAT44(uStack_61c,local_620) + 0x3e) & 0x40) != 0)) {
                      auVar115 = ZEXT1632(auVar158._0_16_);
                      (*p_Var16)(&local_770);
                      auVar210 = ZEXT3264(_local_700);
                      auVar197 = ZEXT3264(local_6e0);
                      auVar183 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar159,CONCAT420(fVar163,
                                                  CONCAT416(fVar159,CONCAT412(fVar163,CONCAT48(
                                                  fVar159,uVar111)))))));
                      auVar188 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,
                                                  CONCAT416(fVar206,CONCAT412(fVar206,CONCAT48(
                                                  fVar206,CONCAT44(fVar206,fVar206))))))));
                      auVar115 = vpcmpeqd_avx2(auVar115,auVar115);
                      auVar158 = ZEXT3264(auVar115);
                      auVar200 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                  }
                  auVar115 = vpcmpeqd_avx2(auVar200._0_32_,local_680);
                  auVar196 = auVar158._0_32_ ^ auVar115;
                  auVar155._8_4_ = 0xff800000;
                  auVar155._0_8_ = 0xff800000ff800000;
                  auVar155._12_4_ = 0xff800000;
                  auVar155._16_4_ = 0xff800000;
                  auVar155._20_4_ = 0xff800000;
                  auVar155._24_4_ = 0xff800000;
                  auVar155._28_4_ = 0xff800000;
                  auVar115 = vblendvps_avx(auVar155,*(undefined1 (*) [32])(local_770.ray + 0x100),
                                           auVar115);
                  *(undefined1 (*) [32])(local_770.ray + 0x100) = auVar115;
                }
                auVar161 = auVar197._0_32_;
                if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar196 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar196 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar196 >> 0x7f,0) != '\0') ||
                      (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar196 >> 0xbf,0) != '\0') ||
                    (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar196[0x1f] < '\0') {
                  uVar103 = CONCAT71((int7)(uVar103 >> 8),1);
                  goto LAB_01301b8f;
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar99;
                uVar20 = uVar103 & 0x3f;
                uVar103 = 0;
                uVar105 = uVar105 ^ 1L << uVar20;
                for (uVar20 = uVar105; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000)
                {
                  uVar103 = uVar103 + 1;
                }
              }
              uVar103 = 0;
            }
          }
          goto LAB_01301b8f;
        }
      }
      uVar103 = 0;
      auVar183 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar159,CONCAT420(fVar163,CONCAT416(fVar159,
                                                  CONCAT412(fVar163,CONCAT48(fVar159,uVar111)))))));
    }
LAB_01301b8f:
    auVar205 = ZEXT3264(auVar205._0_32_);
    auVar200 = ZEXT3264(local_6c0);
    auVar158 = ZEXT464((uint)fVar145);
    if (8 < iVar98) {
      local_5e0._4_4_ = iVar98;
      local_5e0._0_4_ = iVar98;
      local_5e0._8_4_ = iVar98;
      local_5e0._12_4_ = iVar98;
      local_5e0._16_4_ = iVar98;
      local_5e0._20_4_ = iVar98;
      local_5e0._24_4_ = iVar98;
      local_5e0._28_4_ = iVar98;
      local_500._4_4_ = fVar145;
      local_500._0_4_ = fVar145;
      fStack_4f8 = fVar145;
      fStack_4f4 = fVar145;
      fStack_4f0 = fVar145;
      fStack_4ec = fVar145;
      fStack_4e8 = fVar145;
      fStack_4e4 = fVar145;
      local_620 = local_720._0_4_;
      uStack_61c = local_720._0_4_;
      uStack_618 = local_720._0_4_;
      uStack_614 = local_720._0_4_;
      uStack_610 = local_720._0_4_;
      uStack_60c = local_720._0_4_;
      uStack_608 = local_720._0_4_;
      uStack_604 = local_720._0_4_;
      local_160 = 1.0 / (float)local_600._0_4_;
      fStack_15c = local_160;
      fStack_158 = local_160;
      fStack_154 = local_160;
      fStack_150 = local_160;
      fStack_14c = local_160;
      fStack_148 = local_160;
      fStack_144 = local_160;
      local_120 = uVar104;
      uStack_11c = uVar104;
      uStack_118 = uVar104;
      uStack_114 = uVar104;
      uStack_110 = uVar104;
      uStack_10c = uVar104;
      uStack_108 = uVar104;
      uStack_104 = uVar104;
      local_140 = local_580._0_4_;
      uStack_13c = local_580._0_4_;
      uStack_138 = local_580._0_4_;
      uStack_134 = local_580._0_4_;
      uStack_130 = local_580._0_4_;
      uStack_12c = local_580._0_4_;
      uStack_128 = local_580._0_4_;
      uStack_124 = local_580._0_4_;
      _local_700 = auVar210._0_32_;
      local_6e0 = auVar161;
      for (lVar108 = 8; lVar108 < local_650; lVar108 = lVar108 + 8) {
        auVar151 = auVar205._0_32_;
        auVar115 = *(undefined1 (*) [32])(bspline_basis0 + lVar108 * 4 + lVar109);
        auVar196 = *(undefined1 (*) [32])(lVar109 + 0x21fffac + lVar108 * 4);
        auVar121 = *(undefined1 (*) [32])(lVar109 + 0x2200430 + lVar108 * 4);
        pauVar2 = (undefined1 (*) [32])(lVar109 + 0x22008b4 + lVar108 * 4);
        fVar130 = *(float *)*pauVar2;
        fVar81 = *(float *)(*pauVar2 + 4);
        fVar82 = *(float *)(*pauVar2 + 8);
        fVar83 = *(float *)(*pauVar2 + 0xc);
        fVar84 = *(float *)(*pauVar2 + 0x10);
        fVar85 = *(float *)(*pauVar2 + 0x14);
        fVar86 = *(float *)(*pauVar2 + 0x18);
        auVar94 = *(undefined1 (*) [28])*pauVar2;
        auVar197._0_4_ = fVar130 * auVar188._0_4_;
        auVar197._4_4_ = fVar81 * auVar188._4_4_;
        auVar197._8_4_ = fVar82 * auVar188._8_4_;
        auVar197._12_4_ = fVar83 * auVar188._12_4_;
        auVar197._16_4_ = fVar84 * auVar188._16_4_;
        auVar197._20_4_ = fVar85 * auVar188._20_4_;
        auVar197._28_36_ = auVar210._28_36_;
        auVar197._24_4_ = fVar86 * auVar188._24_4_;
        auVar210._0_4_ = fVar130 * auVar183._0_4_;
        auVar210._4_4_ = fVar81 * auVar183._4_4_;
        auVar210._8_4_ = fVar82 * auVar183._8_4_;
        auVar210._12_4_ = fVar83 * auVar183._12_4_;
        auVar210._16_4_ = fVar84 * auVar183._16_4_;
        auVar210._20_4_ = fVar85 * auVar183._20_4_;
        auVar210._28_36_ = auVar158._28_36_;
        auVar210._24_4_ = fVar86 * auVar183._24_4_;
        auVar167 = vfmadd231ps_fma(auVar197._0_32_,auVar121,auVar152);
        auVar164 = vfmadd231ps_fma(auVar210._0_32_,auVar121,auVar203);
        auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar196,auVar198);
        auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar196,local_460);
        auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar115,auVar215);
        auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar115,local_5a0);
        auVar140 = *(undefined1 (*) [32])(bspline_basis1 + lVar108 * 4 + lVar109);
        auVar124 = *(undefined1 (*) [32])(lVar109 + 0x22023cc + lVar108 * 4);
        auVar19 = *(undefined1 (*) [32])(lVar109 + 0x2202850 + lVar108 * 4);
        pauVar3 = (undefined1 (*) [32])(lVar109 + 0x2202cd4 + lVar108 * 4);
        fVar131 = *(float *)*pauVar3;
        fVar143 = *(float *)(*pauVar3 + 4);
        fVar87 = *(float *)(*pauVar3 + 8);
        fVar88 = *(float *)(*pauVar3 + 0xc);
        fVar89 = *(float *)(*pauVar3 + 0x10);
        fVar90 = *(float *)(*pauVar3 + 0x14);
        fVar91 = *(float *)(*pauVar3 + 0x18);
        auVar95 = *(undefined1 (*) [28])*pauVar3;
        auVar158._0_4_ = auVar188._0_4_ * fVar131;
        auVar158._4_4_ = auVar188._4_4_ * fVar143;
        auVar158._8_4_ = auVar188._8_4_ * fVar87;
        auVar158._12_4_ = auVar188._12_4_ * fVar88;
        auVar158._16_4_ = auVar188._16_4_ * fVar89;
        auVar158._20_4_ = auVar188._20_4_ * fVar90;
        auVar158._28_36_ = auVar188._28_36_;
        auVar158._24_4_ = auVar188._24_4_ * fVar91;
        auVar188._0_4_ = auVar183._0_4_ * fVar131;
        auVar188._4_4_ = auVar183._4_4_ * fVar143;
        auVar188._8_4_ = auVar183._8_4_ * fVar87;
        auVar188._12_4_ = auVar183._12_4_ * fVar88;
        auVar188._16_4_ = auVar183._16_4_ * fVar89;
        auVar188._20_4_ = auVar183._20_4_ * fVar90;
        auVar188._28_36_ = auVar183._28_36_;
        auVar188._24_4_ = auVar183._24_4_ * fVar91;
        auVar10 = vfmadd231ps_fma(auVar158._0_32_,auVar19,auVar152);
        auVar11 = vfmadd231ps_fma(auVar188._0_32_,auVar19,auVar203);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar124,auVar198);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar124,local_460);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar140,auVar215);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar140,local_5a0);
        local_4e0 = ZEXT1632(auVar10);
        local_5c0 = ZEXT1632(auVar167);
        auVar199 = vsubps_avx(local_4e0,local_5c0);
        auVar134 = ZEXT1632(auVar11);
        local_720 = ZEXT1632(auVar164);
        local_4c0 = vsubps_avx(auVar134,local_720);
        auVar54._4_4_ = auVar199._4_4_ * auVar164._4_4_;
        auVar54._0_4_ = auVar199._0_4_ * auVar164._0_4_;
        auVar54._8_4_ = auVar199._8_4_ * auVar164._8_4_;
        auVar54._12_4_ = auVar199._12_4_ * auVar164._12_4_;
        auVar54._16_4_ = auVar199._16_4_ * 0.0;
        auVar54._20_4_ = auVar199._20_4_ * 0.0;
        auVar54._24_4_ = auVar199._24_4_ * 0.0;
        auVar54._28_4_ = local_5a0._28_4_;
        fVar145 = local_4c0._0_4_;
        fVar144 = local_4c0._4_4_;
        auVar96._4_4_ = auVar167._4_4_ * fVar144;
        auVar96._0_4_ = auVar167._0_4_ * fVar145;
        fVar125 = local_4c0._8_4_;
        auVar96._8_4_ = auVar167._8_4_ * fVar125;
        fVar126 = local_4c0._12_4_;
        auVar96._12_4_ = auVar167._12_4_ * fVar126;
        fVar127 = local_4c0._16_4_;
        auVar96._16_4_ = fVar127 * 0.0;
        fVar128 = local_4c0._20_4_;
        auVar96._20_4_ = fVar128 * 0.0;
        fVar129 = local_4c0._24_4_;
        auVar96._24_4_ = fVar129 * 0.0;
        auVar96._28_4_ = uVar201;
        auVar210 = ZEXT3264(auVar121);
        auVar123 = vsubps_avx(auVar54,auVar96);
        auVar179._0_4_ = fVar130 * (float)local_100;
        auVar179._4_4_ = fVar81 * local_100._4_4_;
        auVar179._8_4_ = fVar82 * (float)uStack_f8;
        auVar179._12_4_ = fVar83 * uStack_f8._4_4_;
        auVar179._16_4_ = fVar84 * (float)uStack_f0;
        auVar179._20_4_ = fVar85 * uStack_f0._4_4_;
        auVar179._24_4_ = fVar86 * (float)uStack_e8;
        auVar179._28_4_ = 0;
        auVar167 = vfmadd231ps_fma(auVar179,auVar121,local_e0);
        auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),local_c0,auVar196);
        auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),local_a0,auVar115);
        auVar55._4_4_ = local_100._4_4_ * fVar143;
        auVar55._0_4_ = (float)local_100 * fVar131;
        auVar55._8_4_ = (float)uStack_f8 * fVar87;
        auVar55._12_4_ = uStack_f8._4_4_ * fVar88;
        auVar55._16_4_ = (float)uStack_f0 * fVar89;
        auVar55._20_4_ = uStack_f0._4_4_ * fVar90;
        auVar55._24_4_ = (float)uStack_e8 * fVar91;
        auVar55._28_4_ = uStack_e8._4_4_;
        auVar10 = vfmadd231ps_fma(auVar55,auVar19,local_e0);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar124,local_c0);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar140,local_a0);
        auVar158 = ZEXT3264(local_460);
        auVar80._4_4_ = fVar144 * fVar144;
        auVar80._0_4_ = fVar145 * fVar145;
        auVar80._8_4_ = fVar125 * fVar125;
        auVar80._12_4_ = fVar126 * fVar126;
        auVar80._16_4_ = fVar127 * fVar127;
        auVar80._20_4_ = fVar128 * fVar128;
        auVar80._24_4_ = fVar129 * fVar129;
        auVar80._28_4_ = local_460._28_4_;
        auVar12 = vfmadd231ps_fma(auVar80,auVar199,auVar199);
        auVar135 = ZEXT1632(auVar10);
        auVar190 = vmaxps_avx(ZEXT1632(auVar167),auVar135);
        auVar194._0_4_ = auVar190._0_4_ * auVar190._0_4_ * auVar12._0_4_;
        auVar194._4_4_ = auVar190._4_4_ * auVar190._4_4_ * auVar12._4_4_;
        auVar194._8_4_ = auVar190._8_4_ * auVar190._8_4_ * auVar12._8_4_;
        auVar194._12_4_ = auVar190._12_4_ * auVar190._12_4_ * auVar12._12_4_;
        auVar194._16_4_ = auVar190._16_4_ * auVar190._16_4_ * 0.0;
        auVar194._20_4_ = auVar190._20_4_ * auVar190._20_4_ * 0.0;
        auVar194._24_4_ = auVar190._24_4_ * auVar190._24_4_ * 0.0;
        auVar194._28_4_ = 0;
        auVar56._4_4_ = auVar123._4_4_ * auVar123._4_4_;
        auVar56._0_4_ = auVar123._0_4_ * auVar123._0_4_;
        auVar56._8_4_ = auVar123._8_4_ * auVar123._8_4_;
        auVar56._12_4_ = auVar123._12_4_ * auVar123._12_4_;
        auVar56._16_4_ = auVar123._16_4_ * auVar123._16_4_;
        auVar56._20_4_ = auVar123._20_4_ * auVar123._20_4_;
        auVar56._24_4_ = auVar123._24_4_ * auVar123._24_4_;
        auVar56._28_4_ = auVar123._28_4_;
        auVar190 = vcmpps_avx(auVar56,auVar194,2);
        local_360 = (int)lVar108;
        auVar195._4_4_ = local_360;
        auVar195._0_4_ = local_360;
        auVar195._8_4_ = local_360;
        auVar195._12_4_ = local_360;
        auVar195._16_4_ = local_360;
        auVar195._20_4_ = local_360;
        auVar195._24_4_ = local_360;
        auVar195._28_4_ = local_360;
        auVar123 = vpor_avx2(auVar195,_DAT_01fb4ba0);
        auVar18 = vpcmpgtd_avx2(local_5e0,auVar123);
        auVar123 = auVar18 & auVar190;
        if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar123 >> 0x7f,0) == '\0') &&
              (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar123 >> 0xbf,0) == '\0') &&
            (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar123[0x1f]) {
          auVar205 = ZEXT3264(auVar151);
          auVar188 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,CONCAT416(
                                                  fVar206,CONCAT412(fVar206,CONCAT48(fVar206,
                                                  CONCAT44(fVar206,fVar206))))))));
          auVar183 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar159,CONCAT420(fVar163,CONCAT416(
                                                  fVar159,CONCAT412(fVar163,CONCAT48(fVar159,uVar111
                                                                                    )))))));
        }
        else {
          local_580 = vandps_avx(auVar18,auVar190);
          local_4a0._0_4_ = auVar95._0_4_;
          local_4a0._4_4_ = auVar95._4_4_;
          fStack_498 = auVar95._8_4_;
          fStack_494 = auVar95._12_4_;
          fStack_490 = auVar95._16_4_;
          fStack_48c = auVar95._20_4_;
          fStack_488 = auVar95._24_4_;
          auVar57._4_4_ = (float)local_700._4_4_ * (float)local_4a0._4_4_;
          auVar57._0_4_ = (float)local_700._0_4_ * (float)local_4a0._0_4_;
          auVar57._8_4_ = fStack_6f8 * fStack_498;
          auVar57._12_4_ = fStack_6f4 * fStack_494;
          auVar57._16_4_ = fStack_6f0 * fStack_490;
          auVar57._20_4_ = fStack_6ec * fStack_48c;
          auVar57._24_4_ = fStack_6e8 * fStack_488;
          auVar57._28_4_ = auVar190._28_4_;
          auVar10 = vfmadd213ps_fma(auVar19,local_560,auVar57);
          auVar10 = vfmadd213ps_fma(auVar124,local_6e0,ZEXT1632(auVar10));
          auVar10 = vfmadd132ps_fma(auVar140,ZEXT1632(auVar10),local_6a0);
          local_480._0_4_ = auVar94._0_4_;
          local_480._4_4_ = auVar94._4_4_;
          fStack_478 = auVar94._8_4_;
          fStack_474 = auVar94._12_4_;
          fStack_470 = auVar94._16_4_;
          fStack_46c = auVar94._20_4_;
          fStack_468 = auVar94._24_4_;
          auVar58._4_4_ = (float)local_700._4_4_ * (float)local_480._4_4_;
          auVar58._0_4_ = (float)local_700._0_4_ * (float)local_480._0_4_;
          auVar58._8_4_ = fStack_6f8 * fStack_478;
          auVar58._12_4_ = fStack_6f4 * fStack_474;
          auVar58._16_4_ = fStack_6f0 * fStack_470;
          auVar58._20_4_ = fStack_6ec * fStack_46c;
          auVar58._24_4_ = fStack_6e8 * fStack_468;
          auVar58._28_4_ = auVar190._28_4_;
          auVar12 = vfmadd213ps_fma(auVar121,local_560,auVar58);
          auVar12 = vfmadd213ps_fma(auVar196,local_6e0,ZEXT1632(auVar12));
          auVar196 = *(undefined1 (*) [32])(lVar109 + 0x2200d38 + lVar108 * 4);
          auVar121 = *(undefined1 (*) [32])(lVar109 + 0x22011bc + lVar108 * 4);
          auVar140 = *(undefined1 (*) [32])(lVar109 + 0x2201640 + lVar108 * 4);
          pfVar4 = (float *)(lVar109 + 0x2201ac4 + lVar108 * 4);
          fVar145 = *pfVar4;
          fVar144 = pfVar4[1];
          fVar125 = pfVar4[2];
          fVar126 = pfVar4[3];
          fVar127 = pfVar4[4];
          fVar128 = pfVar4[5];
          fVar129 = pfVar4[6];
          auVar191._0_4_ = fVar145 * fVar206;
          auVar191._4_4_ = fVar144 * fVar206;
          auVar191._8_4_ = fVar125 * fVar206;
          auVar191._12_4_ = fVar126 * fVar206;
          auVar191._16_4_ = fVar127 * fVar206;
          auVar191._20_4_ = fVar128 * fVar206;
          auVar191._24_4_ = fVar129 * fVar206;
          auVar191._28_4_ = 0;
          auVar208._0_4_ = fVar145 * fVar159;
          auVar208._4_4_ = fVar144 * fVar163;
          auVar208._8_4_ = fVar125 * fVar159;
          auVar208._12_4_ = fVar126 * fVar163;
          auVar208._16_4_ = fVar127 * fVar159;
          auVar208._20_4_ = fVar128 * fVar163;
          auVar208._24_4_ = fVar129 * fVar159;
          auVar208._28_4_ = 0;
          auVar59._4_4_ = fVar144 * (float)local_700._4_4_;
          auVar59._0_4_ = fVar145 * (float)local_700._0_4_;
          auVar59._8_4_ = fVar125 * fStack_6f8;
          auVar59._12_4_ = fVar126 * fStack_6f4;
          auVar59._16_4_ = fVar127 * fStack_6f0;
          auVar59._20_4_ = fVar128 * fStack_6ec;
          auVar59._24_4_ = fVar129 * fStack_6e8;
          auVar59._28_4_ = pfVar4[7];
          auVar13 = vfmadd231ps_fma(auVar191,auVar140,auVar152);
          auVar112 = vfmadd231ps_fma(auVar208,auVar140,auVar203);
          auVar172 = vfmadd231ps_fma(auVar59,local_560,auVar140);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar121,auVar198);
          auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar121,local_460);
          auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),local_6e0,auVar121);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar196,auVar215);
          auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar196,local_5a0);
          auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),auVar196,local_6a0);
          pfVar4 = (float *)(lVar109 + 0x2203ee4 + lVar108 * 4);
          fVar145 = *pfVar4;
          fVar144 = pfVar4[1];
          fVar125 = pfVar4[2];
          fVar126 = pfVar4[3];
          fVar127 = pfVar4[4];
          fVar128 = pfVar4[5];
          fVar129 = pfVar4[6];
          auVar97._4_4_ = fVar206 * fVar144;
          auVar97._0_4_ = fVar206 * fVar145;
          auVar97._8_4_ = fVar206 * fVar125;
          auVar97._12_4_ = fVar206 * fVar126;
          auVar97._16_4_ = fVar206 * fVar127;
          auVar97._20_4_ = fVar206 * fVar128;
          auVar97._24_4_ = fVar206 * fVar129;
          auVar97._28_4_ = uVar110;
          auVar60._4_4_ = fVar163 * fVar144;
          auVar60._0_4_ = fVar159 * fVar145;
          auVar60._8_4_ = fVar159 * fVar125;
          auVar60._12_4_ = fVar163 * fVar126;
          auVar60._16_4_ = fVar159 * fVar127;
          auVar60._20_4_ = fVar163 * fVar128;
          auVar60._24_4_ = fVar159 * fVar129;
          auVar60._28_4_ = auVar199._28_4_;
          auVar61._4_4_ = fVar144 * (float)local_700._4_4_;
          auVar61._0_4_ = fVar145 * (float)local_700._0_4_;
          auVar61._8_4_ = fVar125 * fStack_6f8;
          auVar61._12_4_ = fVar126 * fStack_6f4;
          auVar61._16_4_ = fVar127 * fStack_6f0;
          auVar61._20_4_ = fVar128 * fStack_6ec;
          auVar61._24_4_ = fVar129 * fStack_6e8;
          auVar61._28_4_ = pfVar4[7];
          auVar196 = *(undefined1 (*) [32])(lVar109 + 0x2203a60 + lVar108 * 4);
          auVar160 = vfmadd231ps_fma(auVar97,auVar196,auVar152);
          auVar177 = vfmadd231ps_fma(auVar60,auVar196,auVar203);
          auVar133 = vfmadd231ps_fma(auVar61,local_560,auVar196);
          auVar196 = *(undefined1 (*) [32])(lVar109 + 0x22035dc + lVar108 * 4);
          auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar196,auVar198);
          auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar196,local_460);
          auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar196,local_6e0);
          auVar196 = *(undefined1 (*) [32])(lVar109 + 0x2203158 + lVar108 * 4);
          auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar196,auVar215);
          auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar196,local_5a0);
          auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),local_6a0,auVar196);
          auVar196 = vandps_avx(ZEXT1632(auVar13),local_420);
          auVar121 = vandps_avx(ZEXT1632(auVar112),local_420);
          auVar121 = vmaxps_avx(auVar196,auVar121);
          auVar196 = vandps_avx(ZEXT1632(auVar172),local_420);
          auVar196 = vmaxps_avx(auVar121,auVar196);
          auVar196 = vcmpps_avx(auVar196,_local_500,1);
          auVar140 = vblendvps_avx(ZEXT1632(auVar13),auVar199,auVar196);
          auVar124 = vblendvps_avx(ZEXT1632(auVar112),local_4c0,auVar196);
          auVar196 = vandps_avx(ZEXT1632(auVar160),local_420);
          auVar121 = vandps_avx(ZEXT1632(auVar177),local_420);
          auVar121 = vmaxps_avx(auVar196,auVar121);
          auVar196 = vandps_avx(local_420,ZEXT1632(auVar133));
          auVar196 = vmaxps_avx(auVar121,auVar196);
          auVar121 = vcmpps_avx(auVar196,_local_500,1);
          auVar196 = vblendvps_avx(ZEXT1632(auVar160),auVar199,auVar121);
          auVar121 = vblendvps_avx(ZEXT1632(auVar177),local_4c0,auVar121);
          auVar12 = vfmadd213ps_fma(auVar115,local_6a0,ZEXT1632(auVar12));
          auVar13 = vfmadd213ps_fma(auVar140,auVar140,ZEXT832(0) << 0x20);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar124,auVar124);
          auVar115 = vrsqrtps_avx(ZEXT1632(auVar13));
          fVar145 = auVar115._0_4_;
          fVar144 = auVar115._4_4_;
          fVar125 = auVar115._8_4_;
          fVar126 = auVar115._12_4_;
          fVar127 = auVar115._16_4_;
          fVar128 = auVar115._20_4_;
          fVar129 = auVar115._24_4_;
          auVar62._4_4_ = fVar144 * fVar144 * fVar144 * auVar13._4_4_ * -0.5;
          auVar62._0_4_ = fVar145 * fVar145 * fVar145 * auVar13._0_4_ * -0.5;
          auVar62._8_4_ = fVar125 * fVar125 * fVar125 * auVar13._8_4_ * -0.5;
          auVar62._12_4_ = fVar126 * fVar126 * fVar126 * auVar13._12_4_ * -0.5;
          auVar62._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
          auVar62._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
          auVar62._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
          auVar62._28_4_ = 0;
          auVar216._8_4_ = 0x3fc00000;
          auVar216._0_8_ = 0x3fc000003fc00000;
          auVar216._12_4_ = 0x3fc00000;
          auVar216._16_4_ = 0x3fc00000;
          auVar216._20_4_ = 0x3fc00000;
          auVar216._24_4_ = 0x3fc00000;
          auVar216._28_4_ = 0x3fc00000;
          auVar13 = vfmadd231ps_fma(auVar62,auVar216,auVar115);
          fVar145 = auVar13._0_4_;
          fVar144 = auVar13._4_4_;
          auVar63._4_4_ = auVar124._4_4_ * fVar144;
          auVar63._0_4_ = auVar124._0_4_ * fVar145;
          fVar125 = auVar13._8_4_;
          auVar63._8_4_ = auVar124._8_4_ * fVar125;
          fVar126 = auVar13._12_4_;
          auVar63._12_4_ = auVar124._12_4_ * fVar126;
          auVar63._16_4_ = auVar124._16_4_ * 0.0;
          auVar63._20_4_ = auVar124._20_4_ * 0.0;
          auVar63._24_4_ = auVar124._24_4_ * 0.0;
          auVar63._28_4_ = auVar124._28_4_;
          auVar64._4_4_ = fVar144 * -auVar140._4_4_;
          auVar64._0_4_ = fVar145 * -auVar140._0_4_;
          auVar64._8_4_ = fVar125 * -auVar140._8_4_;
          auVar64._12_4_ = fVar126 * -auVar140._12_4_;
          auVar64._16_4_ = -auVar140._16_4_ * 0.0;
          auVar64._20_4_ = -auVar140._20_4_ * 0.0;
          auVar64._24_4_ = -auVar140._24_4_ * 0.0;
          auVar64._28_4_ = auVar115._28_4_;
          auVar13 = vfmadd213ps_fma(auVar196,auVar196,ZEXT832(0) << 0x20);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar121,auVar121);
          auVar115 = vrsqrtps_avx(ZEXT1632(auVar13));
          auVar65._28_4_ = local_4c0._28_4_;
          auVar65._0_28_ =
               ZEXT1628(CONCAT412(fVar126 * 0.0,
                                  CONCAT48(fVar125 * 0.0,CONCAT44(fVar144 * 0.0,fVar145 * 0.0))));
          fVar145 = auVar115._0_4_;
          fVar144 = auVar115._4_4_;
          fVar125 = auVar115._8_4_;
          fVar126 = auVar115._12_4_;
          fVar127 = auVar115._16_4_;
          fVar128 = auVar115._20_4_;
          fVar129 = auVar115._24_4_;
          auVar66._4_4_ = fVar144 * fVar144 * fVar144 * auVar13._4_4_ * -0.5;
          auVar66._0_4_ = fVar145 * fVar145 * fVar145 * auVar13._0_4_ * -0.5;
          auVar66._8_4_ = fVar125 * fVar125 * fVar125 * auVar13._8_4_ * -0.5;
          auVar66._12_4_ = fVar126 * fVar126 * fVar126 * auVar13._12_4_ * -0.5;
          auVar66._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
          auVar66._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
          auVar66._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
          auVar66._28_4_ = 0;
          auVar13 = vfmadd231ps_fma(auVar66,auVar216,auVar115);
          fVar145 = auVar13._0_4_;
          fVar144 = auVar13._4_4_;
          auVar67._4_4_ = auVar121._4_4_ * fVar144;
          auVar67._0_4_ = auVar121._0_4_ * fVar145;
          fVar125 = auVar13._8_4_;
          auVar67._8_4_ = auVar121._8_4_ * fVar125;
          fVar126 = auVar13._12_4_;
          auVar67._12_4_ = auVar121._12_4_ * fVar126;
          auVar67._16_4_ = auVar121._16_4_ * 0.0;
          auVar67._20_4_ = auVar121._20_4_ * 0.0;
          auVar67._24_4_ = auVar121._24_4_ * 0.0;
          auVar67._28_4_ = 0;
          auVar68._4_4_ = fVar144 * -auVar196._4_4_;
          auVar68._0_4_ = fVar145 * -auVar196._0_4_;
          auVar68._8_4_ = fVar125 * -auVar196._8_4_;
          auVar68._12_4_ = fVar126 * -auVar196._12_4_;
          auVar68._16_4_ = -auVar196._16_4_ * 0.0;
          auVar68._20_4_ = -auVar196._20_4_ * 0.0;
          auVar68._24_4_ = -auVar196._24_4_ * 0.0;
          auVar68._28_4_ = auVar115._28_4_;
          auVar69._28_4_ = 0xbf000000;
          auVar69._0_28_ =
               ZEXT1628(CONCAT412(fVar126 * 0.0,
                                  CONCAT48(fVar125 * 0.0,CONCAT44(fVar144 * 0.0,fVar145 * 0.0))));
          auVar13 = vfmadd213ps_fma(auVar63,ZEXT1632(auVar167),local_5c0);
          auVar115 = ZEXT1632(auVar167);
          auVar112 = vfmadd213ps_fma(auVar64,auVar115,local_720);
          auVar172 = vfmadd213ps_fma(auVar65,auVar115,ZEXT1632(auVar12));
          auVar133 = vfnmadd213ps_fma(auVar63,auVar115,local_5c0);
          auVar160 = vfmadd213ps_fma(auVar67,auVar135,local_4e0);
          auVar178 = vfnmadd213ps_fma(auVar64,auVar115,local_720);
          auVar177 = vfmadd213ps_fma(auVar68,auVar135,auVar134);
          auVar180 = ZEXT1632(auVar167);
          auVar167 = vfnmadd231ps_fma(ZEXT1632(auVar12),auVar180,auVar65);
          auVar12 = vfmadd213ps_fma(auVar69,auVar135,ZEXT1632(auVar10));
          auVar184 = vfnmadd213ps_fma(auVar67,auVar135,local_4e0);
          auVar185 = vfnmadd213ps_fma(auVar68,auVar135,auVar134);
          auVar193 = vfnmadd231ps_fma(ZEXT1632(auVar10),auVar135,auVar69);
          auVar115 = vsubps_avx(ZEXT1632(auVar177),ZEXT1632(auVar178));
          auVar196 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar167));
          auVar181._0_4_ = auVar115._0_4_ * auVar167._0_4_;
          auVar181._4_4_ = auVar115._4_4_ * auVar167._4_4_;
          auVar181._8_4_ = auVar115._8_4_ * auVar167._8_4_;
          auVar181._12_4_ = auVar115._12_4_ * auVar167._12_4_;
          auVar181._16_4_ = auVar115._16_4_ * 0.0;
          auVar181._20_4_ = auVar115._20_4_ * 0.0;
          auVar181._24_4_ = auVar115._24_4_ * 0.0;
          auVar181._28_4_ = 0;
          auVar10 = vfmsub231ps_fma(auVar181,ZEXT1632(auVar178),auVar196);
          auVar70._4_4_ = auVar133._4_4_ * auVar196._4_4_;
          auVar70._0_4_ = auVar133._0_4_ * auVar196._0_4_;
          auVar70._8_4_ = auVar133._8_4_ * auVar196._8_4_;
          auVar70._12_4_ = auVar133._12_4_ * auVar196._12_4_;
          auVar70._16_4_ = auVar196._16_4_ * 0.0;
          auVar70._20_4_ = auVar196._20_4_ * 0.0;
          auVar70._24_4_ = auVar196._24_4_ * 0.0;
          auVar70._28_4_ = auVar196._28_4_;
          auVar190 = ZEXT1632(auVar133);
          auVar196 = vsubps_avx(ZEXT1632(auVar160),auVar190);
          auVar123 = ZEXT1632(auVar167);
          auVar167 = vfmsub231ps_fma(auVar70,auVar123,auVar196);
          auVar71._4_4_ = auVar178._4_4_ * auVar196._4_4_;
          auVar71._0_4_ = auVar178._0_4_ * auVar196._0_4_;
          auVar71._8_4_ = auVar178._8_4_ * auVar196._8_4_;
          auVar71._12_4_ = auVar178._12_4_ * auVar196._12_4_;
          auVar71._16_4_ = auVar196._16_4_ * 0.0;
          auVar71._20_4_ = auVar196._20_4_ * 0.0;
          auVar71._24_4_ = auVar196._24_4_ * 0.0;
          auVar71._28_4_ = auVar196._28_4_;
          auVar133 = vfmsub231ps_fma(auVar71,auVar190,auVar115);
          auVar167 = vfmadd231ps_fma(ZEXT1632(auVar133),ZEXT832(0) << 0x20,ZEXT1632(auVar167));
          auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
          auVar18 = vcmpps_avx(ZEXT1632(auVar167),ZEXT832(0) << 0x20,2);
          auVar115 = vblendvps_avx(ZEXT1632(auVar184),ZEXT1632(auVar13),auVar18);
          auVar196 = vblendvps_avx(ZEXT1632(auVar185),ZEXT1632(auVar112),auVar18);
          auVar121 = vblendvps_avx(ZEXT1632(auVar193),ZEXT1632(auVar172),auVar18);
          auVar140 = vblendvps_avx(auVar190,ZEXT1632(auVar160),auVar18);
          auVar124 = vblendvps_avx(ZEXT1632(auVar178),ZEXT1632(auVar177),auVar18);
          auVar19 = vblendvps_avx(auVar123,ZEXT1632(auVar12),auVar18);
          auVar190 = vblendvps_avx(ZEXT1632(auVar160),auVar190,auVar18);
          auVar199 = vblendvps_avx(ZEXT1632(auVar177),ZEXT1632(auVar178),auVar18);
          auVar167 = vpackssdw_avx(local_580._0_16_,local_580._16_16_);
          auVar123 = vblendvps_avx(ZEXT1632(auVar12),auVar123,auVar18);
          auVar190 = vsubps_avx(auVar190,auVar115);
          auVar199 = vsubps_avx(auVar199,auVar196);
          auVar134 = vsubps_avx(auVar123,auVar121);
          auVar210 = ZEXT3264(auVar134);
          auVar173 = vsubps_avx(auVar115,auVar140);
          auVar186 = vsubps_avx(auVar196,auVar124);
          auVar187 = vsubps_avx(auVar121,auVar19);
          auVar174._0_4_ = auVar134._0_4_ * auVar115._0_4_;
          auVar174._4_4_ = auVar134._4_4_ * auVar115._4_4_;
          auVar174._8_4_ = auVar134._8_4_ * auVar115._8_4_;
          auVar174._12_4_ = auVar134._12_4_ * auVar115._12_4_;
          auVar174._16_4_ = auVar134._16_4_ * auVar115._16_4_;
          auVar174._20_4_ = auVar134._20_4_ * auVar115._20_4_;
          auVar174._24_4_ = auVar134._24_4_ * auVar115._24_4_;
          auVar174._28_4_ = 0;
          auVar10 = vfmsub231ps_fma(auVar174,auVar121,auVar190);
          auVar72._4_4_ = auVar190._4_4_ * auVar196._4_4_;
          auVar72._0_4_ = auVar190._0_4_ * auVar196._0_4_;
          auVar72._8_4_ = auVar190._8_4_ * auVar196._8_4_;
          auVar72._12_4_ = auVar190._12_4_ * auVar196._12_4_;
          auVar72._16_4_ = auVar190._16_4_ * auVar196._16_4_;
          auVar72._20_4_ = auVar190._20_4_ * auVar196._20_4_;
          auVar72._24_4_ = auVar190._24_4_ * auVar196._24_4_;
          auVar72._28_4_ = auVar123._28_4_;
          auVar12 = vfmsub231ps_fma(auVar72,auVar115,auVar199);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
          auVar175._0_4_ = auVar199._0_4_ * auVar121._0_4_;
          auVar175._4_4_ = auVar199._4_4_ * auVar121._4_4_;
          auVar175._8_4_ = auVar199._8_4_ * auVar121._8_4_;
          auVar175._12_4_ = auVar199._12_4_ * auVar121._12_4_;
          auVar175._16_4_ = auVar199._16_4_ * auVar121._16_4_;
          auVar175._20_4_ = auVar199._20_4_ * auVar121._20_4_;
          auVar175._24_4_ = auVar199._24_4_ * auVar121._24_4_;
          auVar175._28_4_ = 0;
          auVar12 = vfmsub231ps_fma(auVar175,auVar196,auVar134);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
          auVar158 = ZEXT1664(auVar12);
          auVar176._0_4_ = auVar187._0_4_ * auVar140._0_4_;
          auVar176._4_4_ = auVar187._4_4_ * auVar140._4_4_;
          auVar176._8_4_ = auVar187._8_4_ * auVar140._8_4_;
          auVar176._12_4_ = auVar187._12_4_ * auVar140._12_4_;
          auVar176._16_4_ = auVar187._16_4_ * auVar140._16_4_;
          auVar176._20_4_ = auVar187._20_4_ * auVar140._20_4_;
          auVar176._24_4_ = auVar187._24_4_ * auVar140._24_4_;
          auVar176._28_4_ = 0;
          auVar10 = vfmsub231ps_fma(auVar176,auVar173,auVar19);
          auVar73._4_4_ = auVar186._4_4_ * auVar19._4_4_;
          auVar73._0_4_ = auVar186._0_4_ * auVar19._0_4_;
          auVar73._8_4_ = auVar186._8_4_ * auVar19._8_4_;
          auVar73._12_4_ = auVar186._12_4_ * auVar19._12_4_;
          auVar73._16_4_ = auVar186._16_4_ * auVar19._16_4_;
          auVar73._20_4_ = auVar186._20_4_ * auVar19._20_4_;
          auVar73._24_4_ = auVar186._24_4_ * auVar19._24_4_;
          auVar73._28_4_ = auVar19._28_4_;
          auVar13 = vfmsub231ps_fma(auVar73,auVar124,auVar187);
          auVar74._4_4_ = auVar173._4_4_ * auVar124._4_4_;
          auVar74._0_4_ = auVar173._0_4_ * auVar124._0_4_;
          auVar74._8_4_ = auVar173._8_4_ * auVar124._8_4_;
          auVar74._12_4_ = auVar173._12_4_ * auVar124._12_4_;
          auVar74._16_4_ = auVar173._16_4_ * auVar124._16_4_;
          auVar74._20_4_ = auVar173._20_4_ * auVar124._20_4_;
          auVar74._24_4_ = auVar173._24_4_ * auVar124._24_4_;
          auVar74._28_4_ = auVar124._28_4_;
          auVar112 = vfmsub231ps_fma(auVar74,auVar186,auVar140);
          auVar124 = ZEXT832(0) << 0x20;
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar124,ZEXT1632(auVar10));
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar124,ZEXT1632(auVar13));
          auVar140 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
          auVar140 = vcmpps_avx(auVar140,auVar124,2);
          auVar10 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
          auVar167 = vpand_avx(auVar10,auVar167);
          auVar140 = vpmovsxwd_avx2(auVar167);
          if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar140 >> 0x7f,0) == '\0') &&
                (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar140 >> 0xbf,0) == '\0') &&
              (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar140[0x1f]) {
            auVar115 = vpcmpeqd_avx2(auVar190,auVar190);
LAB_01302ef3:
            auVar205 = ZEXT3264(auVar151);
            auVar200 = ZEXT3264(auVar200._0_32_);
            auVar197 = ZEXT3264(auVar115);
            auVar188 = ZEXT3264(CONCAT824(uStack_628,
                                          CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
          }
          else {
            auVar75._4_4_ = auVar199._4_4_ * auVar187._4_4_;
            auVar75._0_4_ = auVar199._0_4_ * auVar187._0_4_;
            auVar75._8_4_ = auVar199._8_4_ * auVar187._8_4_;
            auVar75._12_4_ = auVar199._12_4_ * auVar187._12_4_;
            auVar75._16_4_ = auVar199._16_4_ * auVar187._16_4_;
            auVar75._20_4_ = auVar199._20_4_ * auVar187._20_4_;
            auVar75._24_4_ = auVar199._24_4_ * auVar187._24_4_;
            auVar75._28_4_ = auVar140._28_4_;
            auVar160 = vfmsub231ps_fma(auVar75,auVar186,auVar134);
            auVar182._0_4_ = auVar134._0_4_ * auVar173._0_4_;
            auVar182._4_4_ = auVar134._4_4_ * auVar173._4_4_;
            auVar182._8_4_ = auVar134._8_4_ * auVar173._8_4_;
            auVar182._12_4_ = auVar134._12_4_ * auVar173._12_4_;
            auVar182._16_4_ = auVar134._16_4_ * auVar173._16_4_;
            auVar182._20_4_ = auVar134._20_4_ * auVar173._20_4_;
            auVar182._24_4_ = auVar134._24_4_ * auVar173._24_4_;
            auVar182._28_4_ = 0;
            auVar172 = vfmsub231ps_fma(auVar182,auVar190,auVar187);
            auVar76._4_4_ = auVar190._4_4_ * auVar186._4_4_;
            auVar76._0_4_ = auVar190._0_4_ * auVar186._0_4_;
            auVar76._8_4_ = auVar190._8_4_ * auVar186._8_4_;
            auVar76._12_4_ = auVar190._12_4_ * auVar186._12_4_;
            auVar76._16_4_ = auVar190._16_4_ * auVar186._16_4_;
            auVar76._20_4_ = auVar190._20_4_ * auVar186._20_4_;
            auVar76._24_4_ = auVar190._24_4_ * auVar186._24_4_;
            auVar76._28_4_ = auVar186._28_4_;
            auVar177 = vfmsub231ps_fma(auVar76,auVar173,auVar199);
            auVar10 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar172),ZEXT1632(auVar177));
            auVar112 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar160),auVar124);
            auVar140 = vrcpps_avx(ZEXT1632(auVar112));
            auVar209._8_4_ = 0x3f800000;
            auVar209._0_8_ = 0x3f8000003f800000;
            auVar209._12_4_ = 0x3f800000;
            auVar209._16_4_ = 0x3f800000;
            auVar209._20_4_ = 0x3f800000;
            auVar209._24_4_ = 0x3f800000;
            auVar209._28_4_ = 0x3f800000;
            auVar210 = ZEXT3264(auVar209);
            auVar10 = vfnmadd213ps_fma(auVar140,ZEXT1632(auVar112),auVar209);
            auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar140,auVar140);
            auVar77._4_4_ = auVar177._4_4_ * auVar121._4_4_;
            auVar77._0_4_ = auVar177._0_4_ * auVar121._0_4_;
            auVar77._8_4_ = auVar177._8_4_ * auVar121._8_4_;
            auVar77._12_4_ = auVar177._12_4_ * auVar121._12_4_;
            auVar77._16_4_ = auVar121._16_4_ * 0.0;
            auVar77._20_4_ = auVar121._20_4_ * 0.0;
            auVar77._24_4_ = auVar121._24_4_ * 0.0;
            auVar77._28_4_ = auVar121._28_4_;
            auVar172 = vfmadd231ps_fma(auVar77,auVar196,ZEXT1632(auVar172));
            auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),ZEXT1632(auVar160),auVar115);
            fVar145 = auVar10._0_4_;
            fVar144 = auVar10._4_4_;
            fVar125 = auVar10._8_4_;
            fVar126 = auVar10._12_4_;
            auVar121 = ZEXT1632(CONCAT412(fVar126 * auVar172._12_4_,
                                          CONCAT48(fVar125 * auVar172._8_4_,
                                                   CONCAT44(fVar144 * auVar172._4_4_,
                                                            fVar145 * auVar172._0_4_))));
            uVar99 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar162._4_4_ = uVar99;
            auVar162._0_4_ = uVar99;
            auVar162._8_4_ = uVar99;
            auVar162._12_4_ = uVar99;
            auVar162._16_4_ = uVar99;
            auVar162._20_4_ = uVar99;
            auVar162._24_4_ = uVar99;
            auVar162._28_4_ = uVar99;
            auVar93._4_4_ = uStack_61c;
            auVar93._0_4_ = local_620;
            auVar93._8_4_ = uStack_618;
            auVar93._12_4_ = uStack_614;
            auVar93._16_4_ = uStack_610;
            auVar93._20_4_ = uStack_60c;
            auVar93._24_4_ = uStack_608;
            auVar93._28_4_ = uStack_604;
            auVar115 = vcmpps_avx(auVar93,auVar121,2);
            auVar196 = vcmpps_avx(auVar121,auVar162,2);
            auVar115 = vandps_avx(auVar196,auVar115);
            auVar10 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
            auVar167 = vpand_avx(auVar167,auVar10);
            auVar115 = vpmovsxwd_avx2(auVar167);
            auVar196 = ZEXT1632(auVar112);
            if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar115 >> 0x7f,0) == '\0') &&
                  (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar115 >> 0xbf,0) == '\0') &&
                (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar115[0x1f]) {
              auVar115 = vpcmpeqd_avx2(auVar196,auVar196);
              goto LAB_01302ef3;
            }
            auVar115 = vcmpps_avx(auVar196,ZEXT832(0) << 0x20,4);
            auVar112 = auVar115._16_16_;
            auVar10 = vpackssdw_avx(auVar115._0_16_,auVar112);
            auVar167 = vpand_avx(auVar167,auVar10);
            auVar196 = vpmovsxwd_avx2(auVar167);
            auVar188 = ZEXT3264(CONCAT824(uStack_628,
                                          CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
            auVar115 = vpcmpeqd_avx2(ZEXT1632(auVar112),ZEXT1632(auVar112));
            auVar197 = ZEXT3264(auVar115);
            auVar200 = ZEXT3264(auVar200._0_32_);
            auVar205 = ZEXT3264(auVar151);
            if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar196 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar196 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar196 >> 0x7f,0) != '\0') ||
                  (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar196 >> 0xbf,0) != '\0') ||
                (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar196[0x1f] < '\0') {
              auVar140 = ZEXT1632(CONCAT412(fVar126 * auVar12._12_4_,
                                            CONCAT48(fVar125 * auVar12._8_4_,
                                                     CONCAT44(fVar144 * auVar12._4_4_,
                                                              fVar145 * auVar12._0_4_))));
              auVar78._28_4_ = SUB84(uStack_628,4);
              auVar78._0_28_ =
                   ZEXT1628(CONCAT412(fVar126 * auVar13._12_4_,
                                      CONCAT48(fVar125 * auVar13._8_4_,
                                               CONCAT44(fVar144 * auVar13._4_4_,
                                                        fVar145 * auVar13._0_4_))));
              auVar192._8_4_ = 0x3f800000;
              auVar192._0_8_ = 0x3f8000003f800000;
              auVar192._12_4_ = 0x3f800000;
              auVar192._16_4_ = 0x3f800000;
              auVar192._20_4_ = 0x3f800000;
              auVar192._24_4_ = 0x3f800000;
              auVar192._28_4_ = 0x3f800000;
              auVar115 = vsubps_avx(auVar192,auVar140);
              auVar115 = vblendvps_avx(auVar115,auVar140,auVar18);
              auVar200 = ZEXT3264(auVar115);
              auVar115 = vsubps_avx(auVar192,auVar78);
              local_540 = vblendvps_avx(auVar115,auVar78,auVar18);
              auVar158 = ZEXT3264(local_540);
              auVar188 = ZEXT3264(auVar196);
              auVar205 = ZEXT3264(auVar121);
            }
          }
          auVar115 = auVar188._0_32_;
          local_600 = auVar135;
          if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar115 >> 0x7f,0) == '\0') &&
                (auVar188 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar115 >> 0xbf,0) == '\0') &&
              (auVar188 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar188[0x1f]) {
            auVar188 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,CONCAT416(
                                                  fVar206,CONCAT412(fVar206,CONCAT48(fVar206,
                                                  CONCAT44(fVar206,fVar206))))))));
            auVar183 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar159,CONCAT420(fVar163,CONCAT416(
                                                  fVar159,CONCAT412(fVar163,CONCAT48(fVar159,uVar111
                                                                                    )))))));
          }
          else {
            auVar196 = vsubps_avx(auVar135,auVar180);
            local_6c0 = auVar200._0_32_;
            auVar167 = vfmadd213ps_fma(auVar196,local_6c0,auVar180);
            fVar145 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar79._4_4_ = (auVar167._4_4_ + auVar167._4_4_) * fVar145;
            auVar79._0_4_ = (auVar167._0_4_ + auVar167._0_4_) * fVar145;
            auVar79._8_4_ = (auVar167._8_4_ + auVar167._8_4_) * fVar145;
            auVar79._12_4_ = (auVar167._12_4_ + auVar167._12_4_) * fVar145;
            auVar79._16_4_ = fVar145 * 0.0;
            auVar79._20_4_ = fVar145 * 0.0;
            auVar79._24_4_ = fVar145 * 0.0;
            auVar79._28_4_ = fVar145;
            auVar140 = auVar205._0_32_;
            auVar196 = vcmpps_avx(auVar140,auVar79,6);
            auVar121 = auVar115 & auVar196;
            auVar188 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,CONCAT416(
                                                  fVar206,CONCAT412(fVar206,CONCAT48(fVar206,
                                                  CONCAT44(fVar206,fVar206))))))));
            auVar183 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar159,CONCAT420(fVar163,CONCAT416(
                                                  fVar159,CONCAT412(fVar163,CONCAT48(fVar159,uVar111
                                                                                    )))))));
            if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar121 >> 0x7f,0) != '\0') ||
                  (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0xbf,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar121[0x1f] < '\0') {
              auVar142._8_4_ = 0xbf800000;
              auVar142._0_8_ = 0xbf800000bf800000;
              auVar142._12_4_ = 0xbf800000;
              auVar142._16_4_ = 0xbf800000;
              auVar142._20_4_ = 0xbf800000;
              auVar142._24_4_ = 0xbf800000;
              auVar142._28_4_ = 0xbf800000;
              auVar156._8_4_ = 0x40000000;
              auVar156._0_8_ = 0x4000000040000000;
              auVar156._12_4_ = 0x40000000;
              auVar156._16_4_ = 0x40000000;
              auVar156._20_4_ = 0x40000000;
              auVar156._24_4_ = 0x40000000;
              auVar156._28_4_ = 0x40000000;
              auVar158 = ZEXT3264(auVar156);
              auVar167 = vfmadd213ps_fma(local_540,auVar156,auVar142);
              local_3a0 = ZEXT1632(auVar167);
              local_340 = local_790;
              uStack_338 = uStack_788;
              local_330 = local_7a0;
              uStack_328 = uStack_798;
              pGVar107 = (context->scene->geometries).items[uVar104].ptr;
              local_540 = local_3a0;
              if ((pGVar107->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                pRVar102 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar102 = context->args;
                if ((pRVar102->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar102 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar102 >> 8),1),
                   pGVar107->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_740 = ZEXT1632(CONCAT124(auVar11._4_12_,(int)uVar103));
                  auVar115 = vandps_avx(auVar196,auVar115);
                  fVar145 = (float)local_360;
                  auVar158 = ZEXT3264(CONCAT428(fVar145,CONCAT424(fVar145,CONCAT420(fVar145,
                                                  CONCAT416(fVar145,CONCAT412(fVar145,CONCAT48(
                                                  fVar145,CONCAT44(fVar145,fVar145))))))));
                  local_2e0[0] = (fVar145 + auVar200._0_4_ + 0.0) * local_160;
                  local_2e0[1] = (fVar145 + auVar200._4_4_ + 1.0) * fStack_15c;
                  local_2e0[2] = (fVar145 + auVar200._8_4_ + 2.0) * fStack_158;
                  local_2e0[3] = (fVar145 + auVar200._12_4_ + 3.0) * fStack_154;
                  fStack_2d0 = (fVar145 + auVar200._16_4_ + 4.0) * fStack_150;
                  fStack_2cc = (fVar145 + auVar200._20_4_ + 5.0) * fStack_14c;
                  fStack_2c8 = (fVar145 + auVar200._24_4_ + 6.0) * fStack_148;
                  fStack_2c4 = fVar145 + auVar200._28_4_ + 7.0;
                  local_540._0_8_ = auVar167._0_8_;
                  local_540._8_8_ = auVar167._8_8_;
                  local_2c0 = local_540._0_8_;
                  uStack_2b8 = local_540._8_8_;
                  uStack_2b0 = 0;
                  uStack_2a8 = 0;
                  local_2a0 = auVar140;
                  uVar99 = vmovmskps_avx(auVar115);
                  uVar103 = 0;
                  uVar105 = CONCAT44((int)((ulong)pRVar102 >> 0x20),uVar99);
                  for (uVar20 = uVar105; (uVar20 & 1) == 0;
                      uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                    uVar103 = uVar103 + 1;
                  }
                  local_720 = ZEXT1632(CONCAT88(auVar164._8_8_,pGVar107));
                  _local_4a0 = *pauVar3;
                  _local_480 = *pauVar2;
                  local_3c0 = local_6c0;
                  local_380 = auVar140;
                  local_35c = iVar98;
                  local_350 = uVar171;
                  uStack_348 = uVar92;
                  while (auVar115 = auVar197._0_32_, uVar105 != 0) {
                    uVar99 = *(undefined4 *)(ray + k * 4 + 0x100);
                    fVar145 = local_2e0[uVar103];
                    auVar114._4_4_ = fVar145;
                    auVar114._0_4_ = fVar145;
                    auVar114._8_4_ = fVar145;
                    auVar114._12_4_ = fVar145;
                    local_220._16_4_ = fVar145;
                    local_220._0_16_ = auVar114;
                    local_220._20_4_ = fVar145;
                    local_220._24_4_ = fVar145;
                    local_220._28_4_ = fVar145;
                    local_200 = *(undefined4 *)((long)&local_2c0 + uVar103 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar103 * 4);
                    fVar125 = 1.0 - fVar145;
                    auVar167 = ZEXT416((uint)(fVar145 * fVar125 * 4.0));
                    auVar164 = vfnmsub213ss_fma(auVar114,auVar114,auVar167);
                    auVar167 = vfmadd213ss_fma(ZEXT416((uint)fVar125),ZEXT416((uint)fVar125),
                                               auVar167);
                    fVar144 = auVar167._0_4_ * 0.5;
                    fVar145 = fVar145 * fVar145 * 0.5;
                    auVar168._0_4_ = fVar145 * (float)local_660._0_4_;
                    auVar168._4_4_ = fVar145 * (float)local_660._4_4_;
                    auVar168._8_4_ = fVar145 * fStack_658;
                    auVar168._12_4_ = fVar145 * fStack_654;
                    auVar148._4_4_ = fVar144;
                    auVar148._0_4_ = fVar144;
                    auVar148._8_4_ = fVar144;
                    auVar148._12_4_ = fVar144;
                    auVar167 = vfmadd132ps_fma(auVar148,auVar168,auVar9);
                    fVar145 = auVar164._0_4_ * 0.5;
                    auVar169._4_4_ = fVar145;
                    auVar169._0_4_ = fVar145;
                    auVar169._8_4_ = fVar145;
                    auVar169._12_4_ = fVar145;
                    auVar167 = vfmadd132ps_fma(auVar169,auVar167,auVar8);
                    local_770.context = context->user;
                    fVar145 = fVar125 * -fVar125 * 0.5;
                    auVar149._4_4_ = fVar145;
                    auVar149._0_4_ = fVar145;
                    auVar149._8_4_ = fVar145;
                    auVar149._12_4_ = fVar145;
                    auVar164 = vfmadd132ps_fma(auVar149,auVar167,auVar17);
                    local_280 = auVar164._0_4_;
                    uStack_27c = local_280;
                    uStack_278 = local_280;
                    uStack_274 = local_280;
                    uStack_270 = local_280;
                    uStack_26c = local_280;
                    uStack_268 = local_280;
                    uStack_264 = local_280;
                    auVar167 = vmovshdup_avx(auVar164);
                    local_260 = auVar167._0_8_;
                    uStack_258 = local_260;
                    uStack_250 = local_260;
                    uStack_248 = local_260;
                    auVar167 = vshufps_avx(auVar164,auVar164,0xaa);
                    auVar150._0_8_ = auVar167._0_8_;
                    auVar150._8_8_ = auVar150._0_8_;
                    local_240._16_8_ = auVar150._0_8_;
                    local_240._0_16_ = auVar150;
                    local_240._24_8_ = auVar150._0_8_;
                    auVar158 = ZEXT3264(local_240);
                    uStack_1fc = local_200;
                    uStack_1f8 = local_200;
                    uStack_1f4 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1ec = local_200;
                    uStack_1e8 = local_200;
                    uStack_1e4 = local_200;
                    local_1e0 = CONCAT44(uStack_13c,local_140);
                    uStack_1d8 = CONCAT44(uStack_134,uStack_138);
                    uStack_1d0 = CONCAT44(uStack_12c,uStack_130);
                    uStack_1c8 = CONCAT44(uStack_124,uStack_128);
                    local_1c0 = CONCAT44(uStack_11c,local_120);
                    uStack_1b8 = CONCAT44(uStack_114,uStack_118);
                    uStack_1b0 = CONCAT44(uStack_10c,uStack_110);
                    uStack_1a8 = CONCAT44(uStack_104,uStack_108);
                    local_1a0 = (local_770.context)->instID[0];
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = (local_770.context)->instPrimID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_680 = local_440;
                    local_770.valid = (int *)local_680;
                    local_770.geometryUserPtr = pGVar107->userPtr;
                    local_770.hit = (RTCHitN *)&local_280;
                    local_770.N = 8;
                    local_770.ray = (RTCRayN *)ray;
                    if (pGVar107->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar158 = ZEXT1664(auVar150);
                      auVar115 = ZEXT1632(auVar197._0_16_);
                      auVar210 = ZEXT1664(auVar210._0_16_);
                      (*pGVar107->occlusionFilterN)(&local_770);
                    }
                    auVar196 = vpcmpeqd_avx2(local_680,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar121 = vpcmpeqd_avx2(auVar115,auVar115);
                    auVar115 = auVar121 & ~auVar196;
                    if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar115 >> 0x7f,0) == '\0') &&
                          (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar115 >> 0xbf,0) == '\0') &&
                        (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar115[0x1f]) {
                      auVar196 = auVar121 ^ auVar196;
                    }
                    else {
                      p_Var16 = context->args->filter;
                      if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_720._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar121 = ZEXT1632(auVar121._0_16_);
                        auVar210 = ZEXT1664(auVar210._0_16_);
                        (*p_Var16)(&local_770);
                      }
                      auVar115 = vpcmpeqd_avx2(local_680,SUB6432(ZEXT1664((undefined1  [16])0x0),0))
                      ;
                      auVar121 = vpcmpeqd_avx2(auVar121,auVar121);
                      auVar196 = auVar121 ^ auVar115;
                      auVar157._8_4_ = 0xff800000;
                      auVar157._0_8_ = 0xff800000ff800000;
                      auVar157._12_4_ = 0xff800000;
                      auVar157._16_4_ = 0xff800000;
                      auVar157._20_4_ = 0xff800000;
                      auVar157._24_4_ = 0xff800000;
                      auVar157._28_4_ = 0xff800000;
                      auVar158 = ZEXT3264(auVar157);
                      auVar115 = vblendvps_avx(auVar157,*(undefined1 (*) [32])
                                                         (local_770.ray + 0x100),auVar115);
                      *(undefined1 (*) [32])(local_770.ray + 0x100) = auVar115;
                    }
                    auVar197 = ZEXT3264(auVar121);
                    if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar196 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar196 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar196 >> 0x7f,0) != '\0') ||
                          (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar196 >> 0xbf,0) != '\0') ||
                        (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar196[0x1f] < '\0') {
                      pRVar102 = (RTCIntersectArguments *)0x1;
                      goto LAB_01302f10;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar99;
                    uVar20 = uVar103 & 0x3f;
                    uVar103 = 0;
                    uVar105 = uVar105 ^ 1L << uVar20;
                    for (uVar20 = uVar105; pGVar107 = (Geometry *)local_720._0_8_, (uVar20 & 1) == 0
                        ; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                      uVar103 = uVar103 + 1;
                    }
                  }
                  pRVar102 = (RTCIntersectArguments *)0x0;
LAB_01302f10:
                  auVar200 = ZEXT3264(local_6c0);
                  auVar205 = ZEXT3264(auVar140);
                  auVar188 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,
                                                  CONCAT416(fVar206,CONCAT412(fVar206,CONCAT48(
                                                  fVar206,CONCAT44(fVar206,fVar206))))))));
                  auVar183 = ZEXT3264(CONCAT428(fVar163,CONCAT424(fVar159,CONCAT420(fVar163,
                                                  CONCAT416(fVar159,CONCAT412(fVar163,CONCAT48(
                                                  fVar159,uVar111)))))));
                  uVar103 = (ulong)(uint)local_740._0_4_;
                }
              }
              uVar103 = CONCAT71((int7)(uVar103 >> 8),(byte)uVar103 | (byte)pRVar102);
            }
          }
        }
      }
    }
    if ((uVar103 & 1) != 0) break;
    uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar122._4_4_ = uVar110;
    auVar122._0_4_ = uVar110;
    auVar122._8_4_ = uVar110;
    auVar122._12_4_ = uVar110;
    auVar122._16_4_ = uVar110;
    auVar122._20_4_ = uVar110;
    auVar122._24_4_ = uVar110;
    auVar122._28_4_ = uVar110;
    auVar115 = vcmpps_avx(local_80,auVar122,2);
    uVar104 = vmovmskps_avx(auVar115);
  }
  return local_648 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }